

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  void *pvVar9;
  __int_type_conflict _Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  uint uVar37;
  ulong uVar38;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar50 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar53 [16];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  int iVar101;
  float t1;
  float fVar102;
  undefined1 auVar103 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined4 uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar135;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  vfloat4 b0;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  vfloat4 b0_1;
  undefined1 auVar152 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar153 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  vfloat4 a0_2;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar202;
  float fVar203;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar210;
  float fVar218;
  float fVar219;
  vfloat4 a0_1;
  float fVar220;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar221;
  float fVar231;
  float fVar232;
  vfloat4 a0;
  undefined1 auVar222 [16];
  float fVar233;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  int iVar249;
  undefined1 in_ZMM30 [64];
  undefined1 auVar250 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar251 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_388;
  undefined8 uStack_380;
  RTCFilterFunctionNArguments local_378;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  uint auStack_2f8 [4];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint uStack_168;
  float afStack_164 [7];
  RTCHitN local_148 [16];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar32;
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar230 [32];
  
  PVar4 = prim[1];
  uVar36 = (ulong)(byte)PVar4;
  fVar126 = *(float *)(prim + uVar36 * 0x19 + 0x12);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar49 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar83._16_16_ = vinsertps_avx(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar40 = vsubps_avx(auVar39,*(undefined1 (*) [16])(prim + uVar36 * 0x19 + 6));
  fVar125 = fVar126 * auVar40._0_4_;
  fVar102 = fVar126 * auVar83._16_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar36 * 4 + 6);
  auVar70 = vpmovsxbd_avx2(auVar39);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar36 * 5 + 6);
  auVar68 = vpmovsxbd_avx2(auVar49);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar36 * 6 + 6);
  auVar75 = vpmovsxbd_avx2(auVar48);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar36 * 0xb + 6);
  auVar86 = vpmovsxbd_avx2(auVar47);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar79 = vpmovsxbd_avx2(auVar46);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vcvtdq2ps_avx(auVar79);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar36 + 6);
  auVar69 = vpmovsxbd_avx2(auVar45);
  auVar69 = vcvtdq2ps_avx(auVar69);
  uVar38 = (ulong)(uint)((int)(uVar36 * 9) * 2);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar38 + 6);
  auVar76 = vpmovsxbd_avx2(auVar44);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar38 + uVar36 + 6);
  auVar77 = vpmovsxbd_avx2(auVar43);
  auVar77 = vcvtdq2ps_avx(auVar77);
  uVar31 = (ulong)(uint)((int)(uVar36 * 5) << 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar31 + 6);
  auVar67 = vpmovsxbd_avx2(auVar3);
  auVar78 = vcvtdq2ps_avx(auVar67);
  auVar228._4_4_ = fVar102;
  auVar228._0_4_ = fVar102;
  auVar228._8_4_ = fVar102;
  auVar228._12_4_ = fVar102;
  auVar228._16_4_ = fVar102;
  auVar228._20_4_ = fVar102;
  auVar228._24_4_ = fVar102;
  auVar228._28_4_ = fVar102;
  auVar240._8_4_ = 1;
  auVar240._0_8_ = 0x100000001;
  auVar240._12_4_ = 1;
  auVar240._16_4_ = 1;
  auVar240._20_4_ = 1;
  auVar240._24_4_ = 1;
  auVar240._28_4_ = 1;
  auVar65 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar248 = ZEXT3264(auVar65);
  auVar81 = ZEXT1632(CONCAT412(fVar126 * auVar83._28_4_,
                               CONCAT48(fVar126 * auVar83._24_4_,
                                        CONCAT44(fVar126 * auVar83._20_4_,fVar102))));
  auVar80 = vpermps_avx2(auVar240,auVar81);
  auVar66 = vpermps_avx512vl(auVar65,auVar81);
  fVar102 = auVar66._0_4_;
  fVar189 = auVar66._4_4_;
  auVar81._4_4_ = fVar189 * auVar75._4_4_;
  auVar81._0_4_ = fVar102 * auVar75._0_4_;
  fVar202 = auVar66._8_4_;
  auVar81._8_4_ = fVar202 * auVar75._8_4_;
  fVar203 = auVar66._12_4_;
  auVar81._12_4_ = fVar203 * auVar75._12_4_;
  fVar104 = auVar66._16_4_;
  auVar81._16_4_ = fVar104 * auVar75._16_4_;
  fVar105 = auVar66._20_4_;
  auVar81._20_4_ = fVar105 * auVar75._20_4_;
  fVar106 = auVar66._24_4_;
  auVar81._24_4_ = fVar106 * auVar75._24_4_;
  auVar81._28_4_ = auVar79._28_4_;
  auVar79._4_4_ = auVar69._4_4_ * fVar189;
  auVar79._0_4_ = auVar69._0_4_ * fVar102;
  auVar79._8_4_ = auVar69._8_4_ * fVar202;
  auVar79._12_4_ = auVar69._12_4_ * fVar203;
  auVar79._16_4_ = auVar69._16_4_ * fVar104;
  auVar79._20_4_ = auVar69._20_4_ * fVar105;
  auVar79._24_4_ = auVar69._24_4_ * fVar106;
  auVar79._28_4_ = auVar67._28_4_;
  auVar67._4_4_ = auVar78._4_4_ * fVar189;
  auVar67._0_4_ = auVar78._0_4_ * fVar102;
  auVar67._8_4_ = auVar78._8_4_ * fVar202;
  auVar67._12_4_ = auVar78._12_4_ * fVar203;
  auVar67._16_4_ = auVar78._16_4_ * fVar104;
  auVar67._20_4_ = auVar78._20_4_ * fVar105;
  auVar67._24_4_ = auVar78._24_4_ * fVar106;
  auVar67._28_4_ = auVar66._28_4_;
  auVar39 = vfmadd231ps_fma(auVar81,auVar80,auVar68);
  auVar49 = vfmadd231ps_fma(auVar79,auVar80,auVar87);
  auVar48 = vfmadd231ps_fma(auVar67,auVar77,auVar80);
  auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar228,auVar70);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar228,auVar86);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar76,auVar228);
  auVar229._4_4_ = fVar125;
  auVar229._0_4_ = fVar125;
  auVar229._8_4_ = fVar125;
  auVar229._12_4_ = fVar125;
  auVar229._16_4_ = fVar125;
  auVar229._20_4_ = fVar125;
  auVar229._24_4_ = fVar125;
  auVar229._28_4_ = fVar125;
  auVar67 = ZEXT1632(CONCAT412(fVar126 * auVar40._12_4_,
                               CONCAT48(fVar126 * auVar40._8_4_,
                                        CONCAT44(fVar126 * auVar40._4_4_,fVar125))));
  auVar79 = vpermps_avx2(auVar240,auVar67);
  auVar67 = vpermps_avx512vl(auVar65,auVar67);
  fVar126 = auVar67._0_4_;
  fVar102 = auVar67._4_4_;
  auVar80._4_4_ = fVar102 * auVar75._4_4_;
  auVar80._0_4_ = fVar126 * auVar75._0_4_;
  fVar189 = auVar67._8_4_;
  auVar80._8_4_ = fVar189 * auVar75._8_4_;
  fVar202 = auVar67._12_4_;
  auVar80._12_4_ = fVar202 * auVar75._12_4_;
  fVar203 = auVar67._16_4_;
  auVar80._16_4_ = fVar203 * auVar75._16_4_;
  fVar104 = auVar67._20_4_;
  auVar80._20_4_ = fVar104 * auVar75._20_4_;
  fVar105 = auVar67._24_4_;
  auVar80._24_4_ = fVar105 * auVar75._24_4_;
  auVar80._28_4_ = 1;
  auVar65._4_4_ = auVar69._4_4_ * fVar102;
  auVar65._0_4_ = auVar69._0_4_ * fVar126;
  auVar65._8_4_ = auVar69._8_4_ * fVar189;
  auVar65._12_4_ = auVar69._12_4_ * fVar202;
  auVar65._16_4_ = auVar69._16_4_ * fVar203;
  auVar65._20_4_ = auVar69._20_4_ * fVar104;
  auVar65._24_4_ = auVar69._24_4_ * fVar105;
  auVar65._28_4_ = auVar75._28_4_;
  auVar69._4_4_ = auVar78._4_4_ * fVar102;
  auVar69._0_4_ = auVar78._0_4_ * fVar126;
  auVar69._8_4_ = auVar78._8_4_ * fVar189;
  auVar69._12_4_ = auVar78._12_4_ * fVar202;
  auVar69._16_4_ = auVar78._16_4_ * fVar203;
  auVar69._20_4_ = auVar78._20_4_ * fVar104;
  auVar69._24_4_ = auVar78._24_4_ * fVar105;
  auVar69._28_4_ = auVar67._28_4_;
  auVar47 = vfmadd231ps_fma(auVar80,auVar79,auVar68);
  auVar46 = vfmadd231ps_fma(auVar65,auVar79,auVar87);
  auVar45 = vfmadd231ps_fma(auVar69,auVar79,auVar77);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar229,auVar70);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar229,auVar86);
  auVar89._8_4_ = 0x7fffffff;
  auVar89._0_8_ = 0x7fffffff7fffffff;
  auVar89._12_4_ = 0x7fffffff;
  auVar89._16_4_ = 0x7fffffff;
  auVar89._20_4_ = 0x7fffffff;
  auVar89._24_4_ = 0x7fffffff;
  auVar89._28_4_ = 0x7fffffff;
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar229,auVar76);
  auVar70 = vandps_avx(ZEXT1632(auVar39),auVar89);
  auVar141._8_4_ = 0x219392ef;
  auVar141._0_8_ = 0x219392ef219392ef;
  auVar141._12_4_ = 0x219392ef;
  auVar141._16_4_ = 0x219392ef;
  auVar141._20_4_ = 0x219392ef;
  auVar141._24_4_ = 0x219392ef;
  auVar141._28_4_ = 0x219392ef;
  uVar38 = vcmpps_avx512vl(auVar70,auVar141,1);
  bVar13 = (bool)((byte)uVar38 & 1);
  auVar66._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._0_4_;
  bVar13 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._4_4_;
  bVar13 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._8_4_;
  bVar13 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._12_4_;
  auVar66._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * 0x219392ef;
  auVar66._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * 0x219392ef;
  auVar66._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * 0x219392ef;
  auVar66._28_4_ = (uint)(byte)(uVar38 >> 7) * 0x219392ef;
  auVar70 = vandps_avx(ZEXT1632(auVar49),auVar89);
  uVar38 = vcmpps_avx512vl(auVar70,auVar141,1);
  bVar13 = (bool)((byte)uVar38 & 1);
  auVar82._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar49._0_4_;
  bVar13 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar49._4_4_;
  bVar13 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar49._8_4_;
  bVar13 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar49._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar38 >> 7) * 0x219392ef;
  auVar70 = vandps_avx(ZEXT1632(auVar48),auVar89);
  uVar38 = vcmpps_avx512vl(auVar70,auVar141,1);
  bVar13 = (bool)((byte)uVar38 & 1);
  auVar70._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar48._0_4_;
  bVar13 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar48._4_4_;
  bVar13 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar48._8_4_;
  bVar13 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar48._12_4_;
  auVar70._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * 0x219392ef;
  auVar70._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * 0x219392ef;
  auVar70._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * 0x219392ef;
  auVar70._28_4_ = (uint)(byte)(uVar38 >> 7) * 0x219392ef;
  auVar68 = vrcp14ps_avx512vl(auVar66);
  auVar132._8_4_ = 0x3f800000;
  auVar132._0_8_ = &DAT_3f8000003f800000;
  auVar132._12_4_ = 0x3f800000;
  auVar132._16_4_ = 0x3f800000;
  auVar132._20_4_ = 0x3f800000;
  auVar132._24_4_ = 0x3f800000;
  auVar132._28_4_ = 0x3f800000;
  auVar39 = vfnmadd213ps_fma(auVar66,auVar68,auVar132);
  auVar39 = vfmadd132ps_fma(ZEXT1632(auVar39),auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar82);
  auVar49 = vfnmadd213ps_fma(auVar82,auVar68,auVar132);
  auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar70);
  auVar48 = vfnmadd213ps_fma(auVar70,auVar68,auVar132);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar68,auVar68);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 7 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar47));
  auVar76._4_4_ = auVar39._4_4_ * auVar70._4_4_;
  auVar76._0_4_ = auVar39._0_4_ * auVar70._0_4_;
  auVar76._8_4_ = auVar39._8_4_ * auVar70._8_4_;
  auVar76._12_4_ = auVar39._12_4_ * auVar70._12_4_;
  auVar76._16_4_ = auVar70._16_4_ * 0.0;
  auVar76._20_4_ = auVar70._20_4_ * 0.0;
  auVar76._24_4_ = auVar70._24_4_ * 0.0;
  auVar76._28_4_ = auVar70._28_4_;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 9 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar47));
  auVar69 = vpbroadcastd_avx512vl();
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar88._0_4_ = auVar39._0_4_ * auVar70._0_4_;
  auVar88._4_4_ = auVar39._4_4_ * auVar70._4_4_;
  auVar88._8_4_ = auVar39._8_4_ * auVar70._8_4_;
  auVar88._12_4_ = auVar39._12_4_ * auVar70._12_4_;
  auVar88._16_4_ = auVar70._16_4_ * 0.0;
  auVar88._20_4_ = auVar70._20_4_ * 0.0;
  auVar88._24_4_ = auVar70._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar36 * -2 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar46));
  auVar77._4_4_ = auVar49._4_4_ * auVar70._4_4_;
  auVar77._0_4_ = auVar49._0_4_ * auVar70._0_4_;
  auVar77._8_4_ = auVar49._8_4_ * auVar70._8_4_;
  auVar77._12_4_ = auVar49._12_4_ * auVar70._12_4_;
  auVar77._16_4_ = auVar70._16_4_ * 0.0;
  auVar77._20_4_ = auVar70._20_4_ * 0.0;
  auVar77._24_4_ = auVar70._24_4_ * 0.0;
  auVar77._28_4_ = auVar70._28_4_;
  auVar70 = vcvtdq2ps_avx(auVar68);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar46));
  auVar85._0_4_ = auVar49._0_4_ * auVar70._0_4_;
  auVar85._4_4_ = auVar49._4_4_ * auVar70._4_4_;
  auVar85._8_4_ = auVar49._8_4_ * auVar70._8_4_;
  auVar85._12_4_ = auVar49._12_4_ * auVar70._12_4_;
  auVar85._16_4_ = auVar70._16_4_ * 0.0;
  auVar85._20_4_ = auVar70._20_4_ * 0.0;
  auVar85._24_4_ = auVar70._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 + uVar36 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar45));
  auVar78._4_4_ = auVar70._4_4_ * auVar48._4_4_;
  auVar78._0_4_ = auVar70._0_4_ * auVar48._0_4_;
  auVar78._8_4_ = auVar70._8_4_ * auVar48._8_4_;
  auVar78._12_4_ = auVar70._12_4_ * auVar48._12_4_;
  auVar78._16_4_ = auVar70._16_4_ * 0.0;
  auVar78._20_4_ = auVar70._20_4_ * 0.0;
  auVar78._24_4_ = auVar70._24_4_ * 0.0;
  auVar78._28_4_ = auVar70._28_4_;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 0x17 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar45));
  auVar84._0_4_ = auVar48._0_4_ * auVar70._0_4_;
  auVar84._4_4_ = auVar48._4_4_ * auVar70._4_4_;
  auVar84._8_4_ = auVar48._8_4_ * auVar70._8_4_;
  auVar84._12_4_ = auVar48._12_4_ * auVar70._12_4_;
  auVar84._16_4_ = auVar70._16_4_ * 0.0;
  auVar84._20_4_ = auVar70._20_4_ * 0.0;
  auVar84._24_4_ = auVar70._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar70 = vpminsd_avx2(auVar76,auVar88);
  auVar68 = vpminsd_avx2(auVar77,auVar85);
  auVar70 = vmaxps_avx(auVar70,auVar68);
  auVar68 = vpminsd_avx2(auVar78,auVar84);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar75._4_4_ = uVar107;
  auVar75._0_4_ = uVar107;
  auVar75._8_4_ = uVar107;
  auVar75._12_4_ = uVar107;
  auVar75._16_4_ = uVar107;
  auVar75._20_4_ = uVar107;
  auVar75._24_4_ = uVar107;
  auVar75._28_4_ = uVar107;
  auVar68 = vmaxps_avx512vl(auVar68,auVar75);
  auVar70 = vmaxps_avx(auVar70,auVar68);
  auVar68._8_4_ = 0x3f7ffffa;
  auVar68._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar68._12_4_ = 0x3f7ffffa;
  auVar68._16_4_ = 0x3f7ffffa;
  auVar68._20_4_ = 0x3f7ffffa;
  auVar68._24_4_ = 0x3f7ffffa;
  auVar68._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar70,auVar68);
  auVar70 = vpmaxsd_avx2(auVar76,auVar88);
  auVar68 = vpmaxsd_avx2(auVar77,auVar85);
  auVar70 = vminps_avx(auVar70,auVar68);
  auVar68 = vpmaxsd_avx2(auVar78,auVar84);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar86._4_4_ = uVar107;
  auVar86._0_4_ = uVar107;
  auVar86._8_4_ = uVar107;
  auVar86._12_4_ = uVar107;
  auVar86._16_4_ = uVar107;
  auVar86._20_4_ = uVar107;
  auVar86._24_4_ = uVar107;
  auVar86._28_4_ = uVar107;
  auVar68 = vminps_avx512vl(auVar68,auVar86);
  auVar70 = vminps_avx(auVar70,auVar68);
  auVar87._8_4_ = 0x3f800003;
  auVar87._0_8_ = 0x3f8000033f800003;
  auVar87._12_4_ = 0x3f800003;
  auVar87._16_4_ = 0x3f800003;
  auVar87._20_4_ = 0x3f800003;
  auVar87._24_4_ = 0x3f800003;
  auVar87._28_4_ = 0x3f800003;
  auVar70 = vmulps_avx512vl(auVar70,auVar87);
  uVar16 = vpcmpgtd_avx512vl(auVar69,_DAT_0205a920);
  uVar15 = vcmpps_avx512vl(local_b8,auVar70,2);
  if ((byte)((byte)uVar15 & (byte)uVar16) == 0) {
    return;
  }
  uVar38 = (ulong)(byte)((byte)uVar15 & (byte)uVar16);
  local_2e8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar83._16_16_ = auVar70._16_16_;
  auVar39 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar251 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar242 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar243 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar244 = ZEXT1664(auVar39);
  auVar39 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar250 = ZEXT1664(auVar39);
LAB_01d2ba36:
  lVar35 = 0;
  for (uVar31 = uVar38; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    lVar35 = lVar35 + 1;
  }
  uVar37 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar35 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar37].ptr;
  uVar31 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar5);
  p_Var8 = pGVar7[1].intersectionFilterN;
  pvVar9 = pGVar7[2].userPtr;
  _Var10 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar39 = *(undefined1 (*) [16])(_Var10 + uVar31 * (long)pvVar9);
  auVar49 = *(undefined1 (*) [16])(_Var10 + (uVar31 + 1) * (long)pvVar9);
  auVar48 = *(undefined1 (*) [16])(_Var10 + (uVar31 + 2) * (long)pvVar9);
  auVar47 = *(undefined1 (*) [16])(_Var10 + (long)pvVar9 * (uVar31 + 3));
  lVar35 = *(long *)&pGVar7[1].time_range.upper;
  auVar46 = *(undefined1 (*) [16])(lVar35 + (long)p_Var8 * uVar31);
  auVar45 = *(undefined1 (*) [16])(lVar35 + (long)p_Var8 * (uVar31 + 1));
  auVar44 = *(undefined1 (*) [16])(lVar35 + (long)p_Var8 * (uVar31 + 2));
  uVar38 = uVar38 - 1 & uVar38;
  auVar43 = *(undefined1 (*) [16])(lVar35 + (long)p_Var8 * (uVar31 + 3));
  if (uVar38 != 0) {
    uVar36 = uVar38 - 1 & uVar38;
    for (uVar31 = uVar38; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    }
    if (uVar36 != 0) {
      for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar3 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar126 = *(float *)(ray + k * 4 + 0x30);
  auVar108 = auVar251._0_16_;
  auVar40 = vmulps_avx512vl(auVar43,auVar108);
  auVar41 = vfmadd231ps_avx512vl(auVar40,auVar44,auVar108);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar45,auVar41);
  auVar117._0_4_ = auVar46._0_4_ + auVar40._0_4_;
  auVar117._4_4_ = auVar46._4_4_ + auVar40._4_4_;
  auVar117._8_4_ = auVar46._8_4_ + auVar40._8_4_;
  auVar117._12_4_ = auVar46._12_4_ + auVar40._12_4_;
  auVar50 = auVar242._0_16_;
  auVar40 = vfmadd231ps_avx512vl(auVar41,auVar45,auVar50);
  auVar41 = vfnmadd231ps_avx512vl(auVar40,auVar46,auVar50);
  auVar40 = vmulps_avx512vl(auVar47,auVar108);
  auVar42 = vfmadd231ps_avx512vl(auVar40,auVar48,auVar108);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar49,auVar42);
  auVar222._0_4_ = auVar39._0_4_ + auVar40._0_4_;
  auVar222._4_4_ = auVar39._4_4_ + auVar40._4_4_;
  auVar222._8_4_ = auVar39._8_4_ + auVar40._8_4_;
  auVar222._12_4_ = auVar39._12_4_ + auVar40._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar42,auVar49,auVar50);
  auVar42 = vfnmadd231ps_avx512vl(auVar40,auVar39,auVar50);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar44,auVar43);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar45,auVar108);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar46,auVar108);
  auVar43 = vmulps_avx512vl(auVar43,auVar50);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar50,auVar44);
  auVar45 = vfmadd231ps_avx512vl(auVar44,auVar108,auVar45);
  auVar44 = vfnmadd231ps_avx512vl(auVar45,auVar108,auVar46);
  auVar46 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar47);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar49,auVar108);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar39,auVar108);
  auVar47 = vmulps_avx512vl(auVar47,auVar50);
  auVar48 = vfnmadd231ps_avx512vl(auVar47,auVar50,auVar48);
  auVar49 = vfmadd231ps_avx512vl(auVar48,auVar108,auVar49);
  auVar45 = vfnmadd231ps_avx512vl(auVar49,auVar108,auVar39);
  auVar39 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar49 = vshufps_avx(auVar222,auVar222,0xc9);
  fVar104 = auVar41._0_4_;
  auVar54._0_4_ = fVar104 * auVar49._0_4_;
  fVar105 = auVar41._4_4_;
  auVar54._4_4_ = fVar105 * auVar49._4_4_;
  fVar106 = auVar41._8_4_;
  auVar54._8_4_ = fVar106 * auVar49._8_4_;
  fVar125 = auVar41._12_4_;
  auVar54._12_4_ = fVar125 * auVar49._12_4_;
  auVar49 = vfmsub231ps_fma(auVar54,auVar39,auVar222);
  auVar48 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar49 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar55._0_4_ = fVar104 * auVar49._0_4_;
  auVar55._4_4_ = fVar105 * auVar49._4_4_;
  auVar55._8_4_ = fVar106 * auVar49._8_4_;
  auVar55._12_4_ = fVar125 * auVar49._12_4_;
  auVar39 = vfmsub231ps_fma(auVar55,auVar39,auVar42);
  auVar47 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar49 = vshufps_avx(auVar46,auVar46,0xc9);
  fVar135 = auVar44._0_4_;
  auVar63._0_4_ = fVar135 * auVar49._0_4_;
  fVar143 = auVar44._4_4_;
  auVar63._4_4_ = fVar143 * auVar49._4_4_;
  fVar144 = auVar44._8_4_;
  auVar63._8_4_ = fVar144 * auVar49._8_4_;
  fVar145 = auVar44._12_4_;
  auVar63._12_4_ = fVar145 * auVar49._12_4_;
  auVar49 = vfmsub231ps_fma(auVar63,auVar39,auVar46);
  auVar46 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar49 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar182._0_4_ = auVar49._0_4_ * fVar135;
  auVar182._4_4_ = auVar49._4_4_ * fVar143;
  auVar182._8_4_ = auVar49._8_4_ * fVar144;
  auVar182._12_4_ = auVar49._12_4_ * fVar145;
  auVar49 = vfmsub231ps_fma(auVar182,auVar39,auVar45);
  auVar39 = vdpps_avx(auVar48,auVar48,0x7f);
  auVar45 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar102 = auVar39._0_4_;
  auVar72._16_16_ = auVar83._16_16_;
  auVar72._0_16_ = auVar108;
  auVar71._4_28_ = auVar72._4_28_;
  auVar71._0_4_ = fVar102;
  auVar49 = vrsqrt14ss_avx512f(auVar108,auVar71._0_16_);
  fVar189 = auVar49._0_4_;
  auVar43 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar49 = vdpps_avx(auVar48,auVar47,0x7f);
  fVar202 = fVar189 * 1.5 - auVar43._0_4_ * fVar189 * fVar189 * fVar189;
  fVar210 = fVar202 * auVar48._0_4_;
  fVar218 = fVar202 * auVar48._4_4_;
  fVar219 = fVar202 * auVar48._8_4_;
  fVar220 = fVar202 * auVar48._12_4_;
  auVar190._0_4_ = auVar47._0_4_ * fVar102;
  auVar190._4_4_ = auVar47._4_4_ * fVar102;
  auVar190._8_4_ = auVar47._8_4_ * fVar102;
  auVar190._12_4_ = auVar47._12_4_ * fVar102;
  fVar102 = auVar49._0_4_;
  auVar159._0_4_ = fVar102 * auVar48._0_4_;
  auVar159._4_4_ = fVar102 * auVar48._4_4_;
  auVar159._8_4_ = fVar102 * auVar48._8_4_;
  auVar159._12_4_ = fVar102 * auVar48._12_4_;
  auVar48 = vsubps_avx(auVar190,auVar159);
  auVar49 = vrcp14ss_avx512f(auVar108,auVar71._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar49,ZEXT416(0x40000000));
  fVar102 = auVar49._0_4_ * auVar39._0_4_;
  auVar39 = vdpps_avx(auVar46,auVar46,0x7f);
  fVar189 = auVar39._0_4_;
  auVar74._16_16_ = auVar83._16_16_;
  auVar74._0_16_ = auVar108;
  auVar73._4_28_ = auVar74._4_28_;
  auVar73._0_4_ = fVar189;
  auVar49 = vrsqrt14ss_avx512f(auVar108,auVar73._0_16_);
  fVar203 = auVar49._0_4_;
  auVar49 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  fVar203 = fVar203 * 1.5 - auVar49._0_4_ * fVar203 * fVar203 * fVar203;
  auVar49 = vdpps_avx(auVar46,auVar45,0x7f);
  fVar221 = fVar203 * auVar46._0_4_;
  fVar231 = fVar203 * auVar46._4_4_;
  fVar232 = fVar203 * auVar46._8_4_;
  fVar233 = fVar203 * auVar46._12_4_;
  auVar56._0_4_ = fVar189 * auVar45._0_4_;
  auVar56._4_4_ = fVar189 * auVar45._4_4_;
  auVar56._8_4_ = fVar189 * auVar45._8_4_;
  auVar56._12_4_ = fVar189 * auVar45._12_4_;
  fVar189 = auVar49._0_4_;
  auVar59._0_4_ = fVar189 * auVar46._0_4_;
  auVar59._4_4_ = fVar189 * auVar46._4_4_;
  auVar59._8_4_ = fVar189 * auVar46._8_4_;
  auVar59._12_4_ = fVar189 * auVar46._12_4_;
  auVar47 = vsubps_avx(auVar56,auVar59);
  auVar49 = vrcp14ss_avx512f(auVar108,auVar73._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar49,ZEXT416(0x40000000));
  fVar189 = auVar39._0_4_ * auVar49._0_4_;
  auVar39 = vshufps_avx(auVar117,auVar117,0xff);
  auVar170._0_4_ = fVar210 * auVar39._0_4_;
  auVar170._4_4_ = fVar218 * auVar39._4_4_;
  auVar170._8_4_ = fVar219 * auVar39._8_4_;
  auVar170._12_4_ = fVar220 * auVar39._12_4_;
  local_208 = vsubps_avx(auVar117,auVar170);
  auVar49 = vshufps_avx(auVar41,auVar41,0xff);
  auVar152._0_4_ = auVar49._0_4_ * fVar210 + auVar39._0_4_ * fVar202 * fVar102 * auVar48._0_4_;
  auVar152._4_4_ = auVar49._4_4_ * fVar218 + auVar39._4_4_ * fVar202 * fVar102 * auVar48._4_4_;
  auVar152._8_4_ = auVar49._8_4_ * fVar219 + auVar39._8_4_ * fVar202 * fVar102 * auVar48._8_4_;
  auVar152._12_4_ = auVar49._12_4_ * fVar220 + auVar39._12_4_ * fVar202 * fVar102 * auVar48._12_4_;
  auVar48 = vsubps_avx(auVar41,auVar152);
  local_218._0_4_ = auVar170._0_4_ + auVar117._0_4_;
  local_218._4_4_ = auVar170._4_4_ + auVar117._4_4_;
  fStack_210 = auVar170._8_4_ + auVar117._8_4_;
  fStack_20c = auVar170._12_4_ + auVar117._12_4_;
  auVar39 = vshufps_avx(auVar40,auVar40,0xff);
  auVar57._0_4_ = fVar221 * auVar39._0_4_;
  auVar57._4_4_ = fVar231 * auVar39._4_4_;
  auVar57._8_4_ = fVar232 * auVar39._8_4_;
  auVar57._12_4_ = fVar233 * auVar39._12_4_;
  local_228 = vsubps_avx512vl(auVar40,auVar57);
  auVar49 = vshufps_avx(auVar44,auVar44,0xff);
  auVar118._0_4_ = auVar49._0_4_ * fVar221 + auVar39._0_4_ * fVar203 * auVar47._0_4_ * fVar189;
  auVar118._4_4_ = auVar49._4_4_ * fVar231 + auVar39._4_4_ * fVar203 * auVar47._4_4_ * fVar189;
  auVar118._8_4_ = auVar49._8_4_ * fVar232 + auVar39._8_4_ * fVar203 * auVar47._8_4_ * fVar189;
  auVar118._12_4_ = auVar49._12_4_ * fVar233 + auVar39._12_4_ * fVar203 * auVar47._12_4_ * fVar189;
  auVar39 = vsubps_avx(auVar44,auVar118);
  local_238._0_4_ = auVar40._0_4_ + auVar57._0_4_;
  local_238._4_4_ = auVar40._4_4_ + auVar57._4_4_;
  fStack_230 = auVar40._8_4_ + auVar57._8_4_;
  fStack_22c = auVar40._12_4_ + auVar57._12_4_;
  auVar60._0_4_ = auVar48._0_4_ * 0.33333334;
  auVar60._4_4_ = auVar48._4_4_ * 0.33333334;
  auVar60._8_4_ = auVar48._8_4_ * 0.33333334;
  auVar60._12_4_ = auVar48._12_4_ * 0.33333334;
  local_248 = vaddps_avx512vl(local_208,auVar60);
  auVar52._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar52._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar52._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar52._12_4_ = auVar39._12_4_ * 0.33333334;
  local_258 = vsubps_avx512vl(local_228,auVar52);
  auVar40._0_4_ = (fVar104 + auVar152._0_4_) * 0.33333334;
  auVar40._4_4_ = (fVar105 + auVar152._4_4_) * 0.33333334;
  auVar40._8_4_ = (fVar106 + auVar152._8_4_) * 0.33333334;
  auVar40._12_4_ = (fVar125 + auVar152._12_4_) * 0.33333334;
  _local_268 = vaddps_avx512vl(_local_218,auVar40);
  auVar41._0_4_ = (fVar135 + auVar118._0_4_) * 0.33333334;
  auVar41._4_4_ = (fVar143 + auVar118._4_4_) * 0.33333334;
  auVar41._8_4_ = (fVar144 + auVar118._8_4_) * 0.33333334;
  auVar41._12_4_ = (fVar145 + auVar118._12_4_) * 0.33333334;
  _local_278 = vsubps_avx512vl(_local_238,auVar41);
  local_188 = vsubps_avx(local_208,auVar3);
  uVar107 = local_188._0_4_;
  auVar53._4_4_ = uVar107;
  auVar53._0_4_ = uVar107;
  auVar53._8_4_ = uVar107;
  auVar53._12_4_ = uVar107;
  auVar39 = vshufps_avx(local_188,local_188,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar49 = vshufps_avx(local_188,local_188,0xaa);
  fVar102 = pre->ray_space[k].vz.field_0.m128[0];
  fVar189 = pre->ray_space[k].vz.field_0.m128[1];
  fVar202 = pre->ray_space[k].vz.field_0.m128[2];
  fVar203 = pre->ray_space[k].vz.field_0.m128[3];
  auVar42._0_4_ = fVar102 * auVar49._0_4_;
  auVar42._4_4_ = fVar189 * auVar49._4_4_;
  auVar42._8_4_ = fVar202 * auVar49._8_4_;
  auVar42._12_4_ = fVar203 * auVar49._12_4_;
  auVar39 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar39);
  auVar44 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar53);
  local_198 = vsubps_avx512vl(local_248,auVar3);
  uVar107 = local_198._0_4_;
  auVar61._4_4_ = uVar107;
  auVar61._0_4_ = uVar107;
  auVar61._8_4_ = uVar107;
  auVar61._12_4_ = uVar107;
  auVar39 = vshufps_avx(local_198,local_198,0x55);
  auVar49 = vshufps_avx(local_198,local_198,0xaa);
  auVar51._0_4_ = fVar102 * auVar49._0_4_;
  auVar51._4_4_ = fVar189 * auVar49._4_4_;
  auVar51._8_4_ = fVar202 * auVar49._8_4_;
  auVar51._12_4_ = fVar203 * auVar49._12_4_;
  auVar39 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar2,auVar39);
  auVar43 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar61);
  local_1a8 = vsubps_avx512vl(local_258,auVar3);
  uVar107 = local_1a8._0_4_;
  auVar58._4_4_ = uVar107;
  auVar58._0_4_ = uVar107;
  auVar58._8_4_ = uVar107;
  auVar58._12_4_ = uVar107;
  auVar39 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar49 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar62._0_4_ = fVar102 * auVar49._0_4_;
  auVar62._4_4_ = fVar189 * auVar49._4_4_;
  auVar62._8_4_ = fVar202 * auVar49._8_4_;
  auVar62._12_4_ = fVar203 * auVar49._12_4_;
  auVar39 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar39);
  auVar83._16_16_ = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar58);
  local_1b8 = vsubps_avx512vl(local_228,auVar3);
  uVar107 = local_1b8._0_4_;
  auVar171._4_4_ = uVar107;
  auVar171._0_4_ = uVar107;
  auVar171._8_4_ = uVar107;
  auVar171._12_4_ = uVar107;
  auVar39 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar49 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar64._0_4_ = fVar102 * auVar49._0_4_;
  auVar64._4_4_ = fVar189 * auVar49._4_4_;
  auVar64._8_4_ = fVar202 * auVar49._8_4_;
  auVar64._12_4_ = fVar203 * auVar49._12_4_;
  auVar39 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar39);
  auVar40 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar171);
  local_1c8 = vsubps_avx(_local_218,auVar3);
  uVar107 = local_1c8._0_4_;
  auVar172._4_4_ = uVar107;
  auVar172._0_4_ = uVar107;
  auVar172._8_4_ = uVar107;
  auVar172._12_4_ = uVar107;
  auVar39 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar49 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar191._0_4_ = auVar49._0_4_ * fVar102;
  auVar191._4_4_ = auVar49._4_4_ * fVar189;
  auVar191._8_4_ = auVar49._8_4_ * fVar202;
  auVar191._12_4_ = auVar49._12_4_ * fVar203;
  auVar39 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar2,auVar39);
  auVar41 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar172);
  local_1d8 = vsubps_avx512vl(_local_268,auVar3);
  uVar107 = local_1d8._0_4_;
  auVar173._4_4_ = uVar107;
  auVar173._0_4_ = uVar107;
  auVar173._8_4_ = uVar107;
  auVar173._12_4_ = uVar107;
  auVar39 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar49 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar204._0_4_ = auVar49._0_4_ * fVar102;
  auVar204._4_4_ = auVar49._4_4_ * fVar189;
  auVar204._8_4_ = auVar49._8_4_ * fVar202;
  auVar204._12_4_ = auVar49._12_4_ * fVar203;
  auVar39 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar2,auVar39);
  auVar42 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar173);
  local_1e8 = vsubps_avx512vl(_local_278,auVar3);
  uVar107 = local_1e8._0_4_;
  auVar174._4_4_ = uVar107;
  auVar174._0_4_ = uVar107;
  auVar174._8_4_ = uVar107;
  auVar174._12_4_ = uVar107;
  auVar39 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar49 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar211._0_4_ = auVar49._0_4_ * fVar102;
  auVar211._4_4_ = auVar49._4_4_ * fVar189;
  auVar211._8_4_ = auVar49._8_4_ * fVar202;
  auVar211._12_4_ = auVar49._12_4_ * fVar203;
  auVar39 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar2,auVar39);
  auVar117 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar174);
  local_1f8 = vsubps_avx(_local_238,auVar3);
  uVar107 = local_1f8._0_4_;
  auVar50._4_4_ = uVar107;
  auVar50._0_4_ = uVar107;
  auVar50._8_4_ = uVar107;
  auVar50._12_4_ = uVar107;
  auVar39 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar49 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar160._0_4_ = auVar49._0_4_ * fVar102;
  auVar160._4_4_ = auVar49._4_4_ * fVar189;
  auVar160._8_4_ = auVar49._8_4_ * fVar202;
  auVar160._12_4_ = auVar49._12_4_ * fVar203;
  auVar39 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar2,auVar39);
  auVar3 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar50);
  auVar48 = vmovlhps_avx(auVar44,auVar41);
  auVar47 = vmovlhps_avx(auVar43,auVar42);
  auVar45 = vmovlhps_avx512f(auVar83._16_16_,auVar117);
  _local_328 = vmovlhps_avx512f(auVar40,auVar3);
  auVar49 = vminps_avx(auVar48,auVar47);
  auVar39 = vmaxps_avx(auVar48,auVar47);
  auVar46 = vminps_avx512vl(auVar45,_local_328);
  auVar49 = vminps_avx(auVar49,auVar46);
  auVar46 = vmaxps_avx512vl(auVar45,_local_328);
  auVar39 = vmaxps_avx(auVar39,auVar46);
  auVar46 = vshufpd_avx(auVar49,auVar49,3);
  auVar49 = vminps_avx(auVar49,auVar46);
  auVar46 = vshufpd_avx(auVar39,auVar39,3);
  auVar39 = vmaxps_avx(auVar39,auVar46);
  auVar49 = vandps_avx512vl(auVar49,auVar243._0_16_);
  auVar39 = vandps_avx512vl(auVar39,auVar243._0_16_);
  auVar39 = vmaxps_avx(auVar49,auVar39);
  auVar49 = vmovshdup_avx(auVar39);
  auVar39 = vmaxss_avx(auVar49,auVar39);
  local_308 = vmovddup_avx512vl(auVar44);
  local_318 = vmovddup_avx512vl(auVar43);
  auVar108._8_8_ = auVar83._16_8_;
  auVar108._0_8_ = auVar83._16_8_;
  auVar153._0_8_ = auVar40._0_8_;
  auVar153._8_8_ = auVar153._0_8_;
  local_338 = ZEXT416((uint)(auVar39._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_338);
  auVar39 = vxorps_avx512vl(local_78._0_16_,auVar244._0_16_);
  local_98 = vbroadcastss_avx512vl(auVar39);
  uVar31 = 0;
  auVar39 = vsubps_avx(auVar47,auVar48);
  auVar46 = vsubps_avx512vl(auVar45,auVar47);
  local_178 = vsubps_avx512vl(_local_328,auVar45);
  local_288 = vsubps_avx(_local_218,local_208);
  local_298 = vsubps_avx512vl(_local_268,local_248);
  local_2a8 = vsubps_avx512vl(_local_278,local_258);
  _local_2b8 = vsubps_avx512vl(_local_238,local_228);
  local_2c8 = vpbroadcastd_avx512vl();
  local_2d8 = vpbroadcastd_avx512vl();
  auVar49 = ZEXT816(0x3f80000000000000);
  auVar241 = ZEXT1664(auVar49);
  do {
    auVar51 = auVar241._0_16_;
    auVar44 = vshufps_avx(auVar51,auVar51,0x50);
    auVar223._8_4_ = 0x3f800000;
    auVar223._0_8_ = &DAT_3f8000003f800000;
    auVar223._12_4_ = 0x3f800000;
    auVar230._16_4_ = 0x3f800000;
    auVar230._0_16_ = auVar223;
    auVar230._20_4_ = 0x3f800000;
    auVar230._24_4_ = 0x3f800000;
    auVar230._28_4_ = 0x3f800000;
    auVar43 = vsubps_avx(auVar223,auVar44);
    fVar102 = auVar44._0_4_;
    fVar104 = auVar41._0_4_;
    auVar127._0_4_ = fVar104 * fVar102;
    fVar189 = auVar44._4_4_;
    fVar105 = auVar41._4_4_;
    auVar127._4_4_ = fVar105 * fVar189;
    fVar202 = auVar44._8_4_;
    auVar127._8_4_ = fVar104 * fVar202;
    fVar203 = auVar44._12_4_;
    auVar127._12_4_ = fVar105 * fVar203;
    fVar106 = auVar42._0_4_;
    auVar136._0_4_ = fVar106 * fVar102;
    fVar125 = auVar42._4_4_;
    auVar136._4_4_ = fVar125 * fVar189;
    auVar136._8_4_ = fVar106 * fVar202;
    auVar136._12_4_ = fVar125 * fVar203;
    fVar135 = auVar117._0_4_;
    auVar146._0_4_ = fVar135 * fVar102;
    fVar143 = auVar117._4_4_;
    auVar146._4_4_ = fVar143 * fVar189;
    auVar146._8_4_ = fVar135 * fVar202;
    auVar146._12_4_ = fVar143 * fVar203;
    fVar144 = auVar3._0_4_;
    auVar109._0_4_ = fVar144 * fVar102;
    fVar145 = auVar3._4_4_;
    auVar109._4_4_ = fVar145 * fVar189;
    auVar109._8_4_ = fVar144 * fVar202;
    auVar109._12_4_ = fVar145 * fVar203;
    auVar83._16_16_ = vfmadd231ps_avx512vl(auVar127,auVar43,local_308);
    auVar40 = vfmadd231ps_avx512vl(auVar136,auVar43,local_318);
    auVar50 = vfmadd231ps_avx512vl(auVar146,auVar43,auVar108);
    auVar43 = vfmadd231ps_fma(auVar109,auVar153,auVar43);
    auVar44 = vmovshdup_avx(auVar49);
    fVar189 = auVar49._0_4_;
    fVar102 = (auVar44._0_4_ - fVar189) * 0.04761905;
    auVar169._4_4_ = fVar189;
    auVar169._0_4_ = fVar189;
    auVar169._8_4_ = fVar189;
    auVar169._12_4_ = fVar189;
    auVar169._16_4_ = fVar189;
    auVar169._20_4_ = fVar189;
    auVar169._24_4_ = fVar189;
    auVar169._28_4_ = fVar189;
    auVar122._0_8_ = auVar44._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar122._16_8_ = auVar122._0_8_;
    auVar122._24_8_ = auVar122._0_8_;
    auVar70 = vsubps_avx(auVar122,auVar169);
    uVar107 = auVar83._16_4_;
    auVar123._4_4_ = uVar107;
    auVar123._0_4_ = uVar107;
    auVar123._8_4_ = uVar107;
    auVar123._12_4_ = uVar107;
    auVar123._16_4_ = uVar107;
    auVar123._20_4_ = uVar107;
    auVar123._24_4_ = uVar107;
    auVar123._28_4_ = uVar107;
    auVar186._8_4_ = 1;
    auVar186._0_8_ = 0x100000001;
    auVar186._12_4_ = 1;
    auVar186._16_4_ = 1;
    auVar186._20_4_ = 1;
    auVar186._24_4_ = 1;
    auVar186._28_4_ = 1;
    auVar86 = ZEXT1632(auVar83._16_16_);
    auVar68 = vpermps_avx2(auVar186,auVar86);
    auVar75 = vbroadcastss_avx512vl(auVar40);
    auVar87 = ZEXT1632(auVar40);
    auVar69 = vpermps_avx512vl(auVar186,auVar87);
    auVar76 = vbroadcastss_avx512vl(auVar50);
    auVar66 = ZEXT1632(auVar50);
    auVar77 = vpermps_avx512vl(auVar186,auVar66);
    auVar78 = vbroadcastss_avx512vl(auVar43);
    auVar82 = ZEXT1632(auVar43);
    auVar79 = vpermps_avx512vl(auVar186,auVar82);
    auVar187._4_4_ = fVar102;
    auVar187._0_4_ = fVar102;
    auVar187._8_4_ = fVar102;
    auVar187._12_4_ = fVar102;
    auVar187._16_4_ = fVar102;
    auVar187._20_4_ = fVar102;
    auVar187._24_4_ = fVar102;
    auVar187._28_4_ = fVar102;
    auVar83 = auVar248._0_32_;
    auVar67 = vpermps_avx512vl(auVar83,auVar86);
    auVar157._8_4_ = 3;
    auVar157._0_8_ = 0x300000003;
    auVar157._12_4_ = 3;
    auVar157._16_4_ = 3;
    auVar157._20_4_ = 3;
    auVar157._24_4_ = 3;
    auVar157._28_4_ = 3;
    auVar80 = vpermps_avx512vl(auVar157,auVar86);
    auVar81 = vpermps_avx512vl(auVar83,auVar87);
    auVar86 = vpermps_avx2(auVar157,auVar87);
    auVar65 = vpermps_avx512vl(auVar83,auVar66);
    auVar87 = vpermps_avx2(auVar157,auVar66);
    auVar66 = vpermps_avx512vl(auVar83,auVar82);
    auVar82 = vpermps_avx512vl(auVar157,auVar82);
    auVar44 = vfmadd132ps_fma(auVar70,auVar169,_DAT_02020f20);
    auVar70 = vsubps_avx(auVar230,ZEXT1632(auVar44));
    auVar83 = vmulps_avx512vl(auVar75,ZEXT1632(auVar44));
    auVar88 = ZEXT1632(auVar44);
    auVar84 = vmulps_avx512vl(auVar69,auVar88);
    auVar43 = vfmadd231ps_fma(auVar83,auVar70,auVar123);
    auVar83._16_16_ = vfmadd231ps_fma(auVar84,auVar70,auVar68);
    auVar84 = vmulps_avx512vl(auVar76,auVar88);
    auVar85 = vmulps_avx512vl(auVar77,auVar88);
    auVar75 = vfmadd231ps_avx512vl(auVar84,auVar70,auVar75);
    auVar69 = vfmadd231ps_avx512vl(auVar85,auVar70,auVar69);
    auVar84 = vmulps_avx512vl(auVar78,auVar88);
    auVar85 = ZEXT1632(auVar44);
    auVar79 = vmulps_avx512vl(auVar79,auVar85);
    auVar76 = vfmadd231ps_avx512vl(auVar84,auVar70,auVar76);
    auVar77 = vfmadd231ps_avx512vl(auVar79,auVar70,auVar77);
    fVar202 = auVar44._0_4_;
    fVar203 = auVar44._4_4_;
    auVar19._4_4_ = fVar203 * auVar75._4_4_;
    auVar19._0_4_ = fVar202 * auVar75._0_4_;
    fVar210 = auVar44._8_4_;
    auVar19._8_4_ = fVar210 * auVar75._8_4_;
    fVar218 = auVar44._12_4_;
    auVar19._12_4_ = fVar218 * auVar75._12_4_;
    auVar19._16_4_ = auVar75._16_4_ * 0.0;
    auVar19._20_4_ = auVar75._20_4_ * 0.0;
    auVar19._24_4_ = auVar75._24_4_ * 0.0;
    auVar19._28_4_ = fVar189;
    auVar20._4_4_ = fVar203 * auVar69._4_4_;
    auVar20._0_4_ = fVar202 * auVar69._0_4_;
    auVar20._8_4_ = fVar210 * auVar69._8_4_;
    auVar20._12_4_ = fVar218 * auVar69._12_4_;
    auVar20._16_4_ = auVar69._16_4_ * 0.0;
    auVar20._20_4_ = auVar69._20_4_ * 0.0;
    auVar20._24_4_ = auVar69._24_4_ * 0.0;
    auVar20._28_4_ = auVar68._28_4_;
    auVar43 = vfmadd231ps_fma(auVar19,auVar70,ZEXT1632(auVar43));
    auVar83._16_16_ = vfmadd231ps_fma(auVar20,auVar70,ZEXT1632(auVar83._16_16_));
    auVar115._0_4_ = fVar202 * auVar76._0_4_;
    auVar115._4_4_ = fVar203 * auVar76._4_4_;
    auVar115._8_4_ = fVar210 * auVar76._8_4_;
    auVar115._12_4_ = fVar218 * auVar76._12_4_;
    auVar115._16_4_ = auVar76._16_4_ * 0.0;
    auVar115._20_4_ = auVar76._20_4_ * 0.0;
    auVar115._24_4_ = auVar76._24_4_ * 0.0;
    auVar115._28_4_ = 0;
    auVar21._4_4_ = fVar203 * auVar77._4_4_;
    auVar21._0_4_ = fVar202 * auVar77._0_4_;
    auVar21._8_4_ = fVar210 * auVar77._8_4_;
    auVar21._12_4_ = fVar218 * auVar77._12_4_;
    auVar21._16_4_ = auVar77._16_4_ * 0.0;
    auVar21._20_4_ = auVar77._20_4_ * 0.0;
    auVar21._24_4_ = auVar77._24_4_ * 0.0;
    auVar21._28_4_ = auVar76._28_4_;
    auVar40 = vfmadd231ps_fma(auVar115,auVar70,auVar75);
    auVar50 = vfmadd231ps_fma(auVar21,auVar70,auVar69);
    auVar22._28_4_ = auVar69._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar218 * auVar50._12_4_,
                            CONCAT48(fVar210 * auVar50._8_4_,
                                     CONCAT44(fVar203 * auVar50._4_4_,fVar202 * auVar50._0_4_))));
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar218 * auVar40._12_4_,
                                                  CONCAT48(fVar210 * auVar40._8_4_,
                                                           CONCAT44(fVar203 * auVar40._4_4_,
                                                                    fVar202 * auVar40._0_4_)))),
                               auVar70,ZEXT1632(auVar43));
    auVar53 = vfmadd231ps_fma(auVar22,auVar70,ZEXT1632(auVar83._16_16_));
    auVar68 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar43));
    auVar75 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar83._16_16_));
    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar68 = vmulps_avx512vl(auVar68,auVar69);
    auVar75 = vmulps_avx512vl(auVar75,auVar69);
    auVar181._0_4_ = fVar102 * auVar68._0_4_;
    auVar181._4_4_ = fVar102 * auVar68._4_4_;
    auVar181._8_4_ = fVar102 * auVar68._8_4_;
    auVar181._12_4_ = fVar102 * auVar68._12_4_;
    auVar181._16_4_ = fVar102 * auVar68._16_4_;
    auVar181._20_4_ = fVar102 * auVar68._20_4_;
    auVar181._24_4_ = fVar102 * auVar68._24_4_;
    auVar181._28_4_ = 0;
    auVar68 = vmulps_avx512vl(auVar187,auVar75);
    auVar40 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar118),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar53),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar116._0_4_ = auVar181._0_4_ + auVar118._0_4_;
    auVar116._4_4_ = auVar181._4_4_ + auVar118._4_4_;
    auVar116._8_4_ = auVar181._8_4_ + auVar118._8_4_;
    auVar116._12_4_ = auVar181._12_4_ + auVar118._12_4_;
    auVar116._16_4_ = auVar181._16_4_ + 0.0;
    auVar116._20_4_ = auVar181._20_4_ + 0.0;
    auVar116._24_4_ = auVar181._24_4_ + 0.0;
    auVar116._28_4_ = 0;
    auVar84 = ZEXT1632(auVar40);
    auVar77 = vpermt2ps_avx512vl(auVar181,_DAT_0205fd20,auVar84);
    auVar78 = vaddps_avx512vl(ZEXT1632(auVar53),auVar68);
    auVar79 = vpermt2ps_avx512vl(auVar68,_DAT_0205fd20,auVar84);
    auVar68 = vsubps_avx(auVar75,auVar77);
    auVar77 = vsubps_avx512vl(auVar76,auVar79);
    auVar79 = vmulps_avx512vl(auVar81,auVar85);
    auVar83 = vmulps_avx512vl(auVar86,auVar85);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar70,auVar67);
    auVar67 = vfmadd231ps_avx512vl(auVar83,auVar70,auVar80);
    auVar80 = vmulps_avx512vl(auVar65,auVar85);
    auVar83 = vmulps_avx512vl(auVar87,auVar85);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar70,auVar81);
    auVar86 = vfmadd231ps_avx512vl(auVar83,auVar70,auVar86);
    auVar81 = vmulps_avx512vl(auVar66,auVar85);
    auVar66 = vmulps_avx512vl(auVar82,auVar85);
    auVar43 = vfmadd231ps_fma(auVar81,auVar70,auVar65);
    auVar83._16_16_ = vfmadd231ps_fma(auVar66,auVar70,auVar87);
    auVar81 = vmulps_avx512vl(auVar85,auVar80);
    auVar66 = vmulps_avx512vl(ZEXT1632(auVar44),auVar86);
    auVar79 = vfmadd231ps_avx512vl(auVar81,auVar70,auVar79);
    auVar67 = vfmadd231ps_avx512vl(auVar66,auVar70,auVar67);
    auVar80 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar218 * auVar43._12_4_,
                                            CONCAT48(fVar210 * auVar43._8_4_,
                                                     CONCAT44(fVar203 * auVar43._4_4_,
                                                              fVar202 * auVar43._0_4_)))),auVar70,
                         auVar80);
    auVar86 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar218 * auVar83._28_4_,
                                            CONCAT48(fVar210 * auVar83._24_4_,
                                                     CONCAT44(fVar203 * auVar83._20_4_,
                                                              fVar202 * auVar83._16_4_)))),auVar70,
                         auVar86);
    auVar23._4_4_ = fVar203 * auVar80._4_4_;
    auVar23._0_4_ = fVar202 * auVar80._0_4_;
    auVar23._8_4_ = fVar210 * auVar80._8_4_;
    auVar23._12_4_ = fVar218 * auVar80._12_4_;
    auVar23._16_4_ = auVar80._16_4_ * 0.0;
    auVar23._20_4_ = auVar80._20_4_ * 0.0;
    auVar23._24_4_ = auVar80._24_4_ * 0.0;
    auVar23._28_4_ = auVar87._28_4_;
    auVar24._4_4_ = fVar203 * auVar86._4_4_;
    auVar24._0_4_ = fVar202 * auVar86._0_4_;
    auVar24._8_4_ = fVar210 * auVar86._8_4_;
    auVar24._12_4_ = fVar218 * auVar86._12_4_;
    auVar24._16_4_ = auVar86._16_4_ * 0.0;
    auVar24._20_4_ = auVar86._20_4_ * 0.0;
    auVar24._24_4_ = auVar86._24_4_ * 0.0;
    auVar24._28_4_ = auVar65._28_4_;
    auVar87 = vfmadd231ps_avx512vl(auVar23,auVar70,auVar79);
    auVar81 = vfmadd231ps_avx512vl(auVar24,auVar67,auVar70);
    auVar70 = vsubps_avx512vl(auVar80,auVar79);
    auVar86 = vsubps_avx512vl(auVar86,auVar67);
    auVar70 = vmulps_avx512vl(auVar70,auVar69);
    auVar86 = vmulps_avx512vl(auVar86,auVar69);
    fVar189 = fVar102 * auVar70._0_4_;
    fVar202 = fVar102 * auVar70._4_4_;
    auVar25._4_4_ = fVar202;
    auVar25._0_4_ = fVar189;
    fVar203 = fVar102 * auVar70._8_4_;
    auVar25._8_4_ = fVar203;
    fVar210 = fVar102 * auVar70._12_4_;
    auVar25._12_4_ = fVar210;
    fVar218 = fVar102 * auVar70._16_4_;
    auVar25._16_4_ = fVar218;
    fVar219 = fVar102 * auVar70._20_4_;
    auVar25._20_4_ = fVar219;
    fVar102 = fVar102 * auVar70._24_4_;
    auVar25._24_4_ = fVar102;
    auVar25._28_4_ = auVar70._28_4_;
    auVar86 = vmulps_avx512vl(auVar187,auVar86);
    auVar69 = vpermt2ps_avx512vl(auVar87,_DAT_0205fd20,auVar84);
    auVar79 = vpermt2ps_avx512vl(auVar81,_DAT_0205fd20,auVar84);
    auVar188._0_4_ = auVar87._0_4_ + fVar189;
    auVar188._4_4_ = auVar87._4_4_ + fVar202;
    auVar188._8_4_ = auVar87._8_4_ + fVar203;
    auVar188._12_4_ = auVar87._12_4_ + fVar210;
    auVar188._16_4_ = auVar87._16_4_ + fVar218;
    auVar188._20_4_ = auVar87._20_4_ + fVar219;
    auVar188._24_4_ = auVar87._24_4_ + fVar102;
    auVar188._28_4_ = auVar87._28_4_ + auVar70._28_4_;
    auVar70 = vpermt2ps_avx512vl(auVar25,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar67 = vaddps_avx512vl(auVar81,auVar86);
    auVar86 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar70 = vsubps_avx(auVar69,auVar70);
    auVar86 = vsubps_avx512vl(auVar79,auVar86);
    auVar132 = ZEXT1632(auVar118);
    auVar80 = vsubps_avx512vl(auVar87,auVar132);
    auVar141 = ZEXT1632(auVar53);
    auVar65 = vsubps_avx512vl(auVar81,auVar141);
    auVar66 = vsubps_avx512vl(auVar69,auVar75);
    auVar80 = vaddps_avx512vl(auVar80,auVar66);
    auVar66 = vsubps_avx512vl(auVar79,auVar76);
    auVar65 = vaddps_avx512vl(auVar65,auVar66);
    auVar66 = vmulps_avx512vl(auVar141,auVar80);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar132,auVar65);
    auVar82 = vmulps_avx512vl(auVar78,auVar80);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar116,auVar65);
    auVar83 = vmulps_avx512vl(auVar77,auVar80);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar68,auVar65);
    auVar84 = vmulps_avx512vl(auVar76,auVar80);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar75,auVar65);
    auVar85 = vmulps_avx512vl(auVar81,auVar80);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar87,auVar65);
    auVar88 = vmulps_avx512vl(auVar67,auVar80);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar188,auVar65);
    auVar89 = vmulps_avx512vl(auVar86,auVar80);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar70,auVar65);
    auVar80 = vmulps_avx512vl(auVar79,auVar80);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar69,auVar65);
    auVar65 = vminps_avx512vl(auVar66,auVar82);
    auVar66 = vmaxps_avx512vl(auVar66,auVar82);
    auVar82 = vminps_avx512vl(auVar83,auVar84);
    auVar65 = vminps_avx512vl(auVar65,auVar82);
    auVar82 = vmaxps_avx512vl(auVar83,auVar84);
    auVar66 = vmaxps_avx512vl(auVar66,auVar82);
    auVar82 = vminps_avx512vl(auVar85,auVar88);
    auVar83 = vmaxps_avx512vl(auVar85,auVar88);
    auVar84 = vminps_avx512vl(auVar89,auVar80);
    auVar82 = vminps_avx512vl(auVar82,auVar84);
    auVar65 = vminps_avx512vl(auVar65,auVar82);
    auVar80 = vmaxps_avx512vl(auVar89,auVar80);
    auVar80 = vmaxps_avx512vl(auVar83,auVar80);
    auVar80 = vmaxps_avx512vl(auVar66,auVar80);
    uVar15 = vcmpps_avx512vl(auVar65,local_78,2);
    uVar16 = vcmpps_avx512vl(auVar80,local_98,5);
    uVar33 = 0;
    bVar29 = (byte)uVar15 & (byte)uVar16 & 0x7f;
    if (bVar29 != 0) {
      auVar80 = vsubps_avx512vl(auVar75,auVar132);
      auVar65 = vsubps_avx512vl(auVar76,auVar141);
      auVar66 = vsubps_avx512vl(auVar69,auVar87);
      auVar80 = vaddps_avx512vl(auVar80,auVar66);
      auVar66 = vsubps_avx512vl(auVar79,auVar81);
      auVar65 = vaddps_avx512vl(auVar65,auVar66);
      auVar66 = vmulps_avx512vl(auVar141,auVar80);
      auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar65,auVar132);
      auVar78 = vmulps_avx512vl(auVar78,auVar80);
      auVar78 = vfnmadd213ps_avx512vl(auVar116,auVar65,auVar78);
      auVar77 = vmulps_avx512vl(auVar77,auVar80);
      auVar77 = vfnmadd213ps_avx512vl(auVar68,auVar65,auVar77);
      auVar68 = vmulps_avx512vl(auVar76,auVar80);
      auVar76 = vfnmadd231ps_avx512vl(auVar68,auVar65,auVar75);
      auVar68 = vmulps_avx512vl(auVar81,auVar80);
      auVar87 = vfnmadd231ps_avx512vl(auVar68,auVar65,auVar87);
      auVar68 = vmulps_avx512vl(auVar67,auVar80);
      auVar67 = vfnmadd213ps_avx512vl(auVar188,auVar65,auVar68);
      auVar68 = vmulps_avx512vl(auVar86,auVar80);
      auVar81 = vfnmadd213ps_avx512vl(auVar70,auVar65,auVar68);
      auVar70 = vmulps_avx512vl(auVar79,auVar80);
      auVar69 = vfnmadd231ps_avx512vl(auVar70,auVar69,auVar65);
      auVar68 = vminps_avx(auVar66,auVar78);
      auVar70 = vmaxps_avx(auVar66,auVar78);
      auVar75 = vminps_avx(auVar77,auVar76);
      auVar75 = vminps_avx(auVar68,auVar75);
      auVar68 = vmaxps_avx(auVar77,auVar76);
      auVar70 = vmaxps_avx(auVar70,auVar68);
      auVar86 = vminps_avx(auVar87,auVar67);
      auVar68 = vmaxps_avx(auVar87,auVar67);
      auVar87 = vminps_avx(auVar81,auVar69);
      auVar86 = vminps_avx(auVar86,auVar87);
      auVar86 = vminps_avx(auVar75,auVar86);
      auVar75 = vmaxps_avx(auVar81,auVar69);
      auVar68 = vmaxps_avx(auVar68,auVar75);
      auVar70 = vmaxps_avx(auVar70,auVar68);
      uVar15 = vcmpps_avx512vl(auVar70,local_98,5);
      uVar16 = vcmpps_avx512vl(auVar86,local_78,2);
      uVar33 = (uint)(bVar29 & (byte)uVar15 & (byte)uVar16);
    }
    if (uVar33 != 0) {
      auStack_2f8[uVar31] = uVar33;
      uVar15 = vmovlps_avx(auVar49);
      *(undefined8 *)(&uStack_168 + uVar31 * 2) = uVar15;
      uVar36 = vmovlps_avx512f(auVar51);
      auStack_58[uVar31] = uVar36;
      uVar31 = (ulong)((int)uVar31 + 1);
    }
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar242 = ZEXT1664(auVar49);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar243 = ZEXT1664(auVar49);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar244 = ZEXT1664(auVar49);
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar245 = ZEXT3264(auVar70);
    auVar246 = ZEXT464(0x3f800000);
    auVar83._16_16_ = auVar70._16_16_;
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar247 = ZEXT1664(auVar49);
    do {
      auVar49 = auVar247._0_16_;
      auVar44 = auVar251._0_16_;
      if ((int)uVar31 == 0) {
        uVar107 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar18._4_4_ = uVar107;
        auVar18._0_4_ = uVar107;
        auVar18._8_4_ = uVar107;
        auVar18._12_4_ = uVar107;
        auVar18._16_4_ = uVar107;
        auVar18._20_4_ = uVar107;
        auVar18._24_4_ = uVar107;
        auVar18._28_4_ = uVar107;
        uVar15 = vcmpps_avx512vl(local_b8,auVar18,2);
        uVar37 = (uint)uVar38 & (uint)uVar15;
        uVar38 = (ulong)uVar37;
        if (uVar37 == 0) {
          return;
        }
        goto LAB_01d2ba36;
      }
      uVar30 = (int)uVar31 - 1;
      uVar32 = (ulong)uVar30;
      uVar33 = (&uStack_168)[uVar32 * 2];
      fVar102 = afStack_164[uVar32 * 2];
      uVar6 = auStack_2f8[uVar32];
      auVar239._8_8_ = 0;
      auVar239._0_8_ = auStack_58[uVar32];
      auVar241 = ZEXT1664(auVar239);
      lVar35 = 0;
      for (uVar36 = (ulong)uVar6; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        lVar35 = lVar35 + 1;
      }
      uVar34 = uVar6 - 1 & uVar6;
      auStack_2f8[uVar32] = uVar34;
      if (uVar34 == 0) {
        uVar31 = (ulong)uVar30;
      }
      auVar119._0_4_ = (float)lVar35;
      auVar119._4_8_ = SUB128(ZEXT812(0),4);
      auVar119._12_4_ = 0;
      auVar43 = vmulss_avx512f(auVar119,SUB6416(ZEXT464(0x3e124925),0));
      lVar35 = lVar35 + 1;
      auVar83._16_16_ = vmulss_avx512f(ZEXT416((uint)(float)lVar35),SUB6416(ZEXT464(0x3e124925),0));
      auVar118 = auVar246._0_16_;
      auVar40 = vsubss_avx512f(auVar118,auVar43);
      auVar43 = vmulss_avx512f(ZEXT416((uint)fVar102),auVar43);
      auVar40 = vfmadd231ss_avx512f(auVar43,ZEXT416(uVar33),auVar40);
      auVar43 = vsubss_avx512f(auVar118,auVar83._16_16_);
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar102 * auVar83._16_4_)),ZEXT416(uVar33),auVar43);
      auVar50 = vsubss_avx512f(auVar43,auVar40);
      vucomiss_avx512f(auVar50);
      if (uVar6 == 0 || lVar35 == 0) break;
      auVar83._16_16_ = vshufps_avx(auVar239,auVar239,0x50);
      vucomiss_avx512f(auVar50);
      auVar51 = vsubps_avx512vl(auVar49,auVar83._16_16_);
      fVar102 = auVar83._16_4_;
      auVar128._0_4_ = fVar104 * fVar102;
      fVar189 = auVar83._20_4_;
      auVar128._4_4_ = fVar105 * fVar189;
      fVar202 = auVar83._24_4_;
      auVar128._8_4_ = fVar104 * fVar202;
      fVar203 = auVar83._28_4_;
      auVar128._12_4_ = fVar105 * fVar203;
      auVar137._0_4_ = fVar106 * fVar102;
      auVar137._4_4_ = fVar125 * fVar189;
      auVar137._8_4_ = fVar106 * fVar202;
      auVar137._12_4_ = fVar125 * fVar203;
      auVar147._0_4_ = fVar135 * fVar102;
      auVar147._4_4_ = fVar143 * fVar189;
      auVar147._8_4_ = fVar135 * fVar202;
      auVar147._12_4_ = fVar143 * fVar203;
      auVar110._0_4_ = fVar144 * fVar102;
      auVar110._4_4_ = fVar145 * fVar189;
      auVar110._8_4_ = fVar144 * fVar202;
      auVar110._12_4_ = fVar145 * fVar203;
      auVar83._16_16_ = vfmadd231ps_fma(auVar128,auVar51,local_308);
      auVar53 = vfmadd231ps_fma(auVar137,auVar51,local_318);
      auVar52 = vfmadd231ps_avx512vl(auVar147,auVar51,auVar108);
      auVar51 = vfmadd231ps_fma(auVar110,auVar153,auVar51);
      auVar124._16_16_ = auVar83._16_16_;
      auVar124._0_16_ = auVar83._16_16_;
      auVar133._16_16_ = auVar53;
      auVar133._0_16_ = auVar53;
      auVar142._16_16_ = auVar52;
      auVar142._0_16_ = auVar52;
      uVar107 = auVar40._0_4_;
      auVar158._4_4_ = uVar107;
      auVar158._0_4_ = uVar107;
      auVar158._8_4_ = uVar107;
      auVar158._12_4_ = uVar107;
      uVar107 = auVar43._0_4_;
      auVar158._20_4_ = uVar107;
      auVar158._16_4_ = uVar107;
      auVar158._24_4_ = uVar107;
      auVar158._28_4_ = uVar107;
      auVar70 = vsubps_avx(auVar133,auVar124);
      auVar53 = vfmadd213ps_fma(auVar70,auVar158,auVar124);
      auVar70 = vsubps_avx(auVar142,auVar133);
      auVar60 = vfmadd213ps_fma(auVar70,auVar158,auVar133);
      auVar83._16_16_ = vsubps_avx(auVar51,auVar52);
      auVar134._16_16_ = auVar83._16_16_;
      auVar134._0_16_ = auVar83._16_16_;
      auVar83._16_16_ = vfmadd213ps_fma(auVar134,auVar158,auVar142);
      auVar70 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar53));
      auVar53 = vfmadd213ps_fma(auVar70,auVar158,ZEXT1632(auVar53));
      auVar70 = vsubps_avx(ZEXT1632(auVar83._16_16_),ZEXT1632(auVar60));
      auVar83._16_16_ = vfmadd213ps_fma(auVar70,auVar158,ZEXT1632(auVar60));
      auVar70 = vsubps_avx(ZEXT1632(auVar83._16_16_),ZEXT1632(auVar53));
      auVar58 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar70,auVar158);
      auVar70 = vmulps_avx512vl(auVar70,auVar245._0_32_);
      auVar83._16_16_ = auVar70._16_16_;
      fVar102 = auVar50._0_4_ * 0.33333334;
      auVar148._0_8_ =
           CONCAT44(auVar58._4_4_ + fVar102 * auVar70._4_4_,auVar58._0_4_ + fVar102 * auVar70._0_4_)
      ;
      auVar148._8_4_ = auVar58._8_4_ + fVar102 * auVar70._8_4_;
      auVar148._12_4_ = auVar58._12_4_ + fVar102 * auVar70._12_4_;
      auVar129._0_4_ = fVar102 * auVar70._16_4_;
      auVar129._4_4_ = fVar102 * auVar70._20_4_;
      auVar129._8_4_ = fVar102 * auVar70._24_4_;
      auVar129._12_4_ = fVar102 * auVar70._28_4_;
      auVar152 = vsubps_avx((undefined1  [16])0x0,auVar129);
      auVar63 = vshufpd_avx(auVar58,auVar58,3);
      auVar59 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar53 = vsubps_avx(auVar63,auVar58);
      auVar51 = vsubps_avx(auVar59,(undefined1  [16])0x0);
      auVar161._0_4_ = auVar51._0_4_ + auVar53._0_4_;
      auVar161._4_4_ = auVar51._4_4_ + auVar53._4_4_;
      auVar161._8_4_ = auVar51._8_4_ + auVar53._8_4_;
      auVar161._12_4_ = auVar51._12_4_ + auVar53._12_4_;
      auVar53 = vshufps_avx(auVar58,auVar58,0xb1);
      auVar51 = vshufps_avx(auVar148,auVar148,0xb1);
      auVar60 = vshufps_avx(auVar152,auVar152,0xb1);
      auVar52 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar212._4_4_ = auVar161._0_4_;
      auVar212._0_4_ = auVar161._0_4_;
      auVar212._8_4_ = auVar161._0_4_;
      auVar212._12_4_ = auVar161._0_4_;
      auVar61 = vshufps_avx(auVar161,auVar161,0x55);
      fVar102 = auVar61._0_4_;
      auVar175._0_4_ = auVar53._0_4_ * fVar102;
      fVar189 = auVar61._4_4_;
      auVar175._4_4_ = auVar53._4_4_ * fVar189;
      fVar202 = auVar61._8_4_;
      auVar175._8_4_ = auVar53._8_4_ * fVar202;
      fVar203 = auVar61._12_4_;
      auVar175._12_4_ = auVar53._12_4_ * fVar203;
      auVar183._0_4_ = auVar51._0_4_ * fVar102;
      auVar183._4_4_ = auVar51._4_4_ * fVar189;
      auVar183._8_4_ = auVar51._8_4_ * fVar202;
      auVar183._12_4_ = auVar51._12_4_ * fVar203;
      auVar192._0_4_ = auVar60._0_4_ * fVar102;
      auVar192._4_4_ = auVar60._4_4_ * fVar189;
      auVar192._8_4_ = auVar60._8_4_ * fVar202;
      auVar192._12_4_ = auVar60._12_4_ * fVar203;
      auVar162._0_4_ = auVar52._0_4_ * fVar102;
      auVar162._4_4_ = auVar52._4_4_ * fVar189;
      auVar162._8_4_ = auVar52._8_4_ * fVar202;
      auVar162._12_4_ = auVar52._12_4_ * fVar203;
      auVar53 = vfmadd231ps_fma(auVar175,auVar212,auVar58);
      auVar51 = vfmadd231ps_fma(auVar183,auVar212,auVar148);
      auVar61 = vfmadd231ps_fma(auVar192,auVar212,auVar152);
      auVar57 = vfmadd231ps_fma(auVar162,(undefined1  [16])0x0,auVar212);
      auVar62 = vshufpd_avx(auVar53,auVar53,1);
      auVar54 = vshufpd_avx(auVar51,auVar51,1);
      auVar55 = vshufpd_avx(auVar61,auVar61,1);
      auVar56 = vshufpd_avx(auVar57,auVar57,1);
      auVar60 = vminss_avx(auVar53,auVar51);
      auVar53 = vmaxss_avx(auVar51,auVar53);
      auVar52 = vminss_avx(auVar61,auVar57);
      auVar51 = vmaxss_avx(auVar57,auVar61);
      auVar52 = vminss_avx(auVar60,auVar52);
      auVar53 = vmaxss_avx(auVar51,auVar53);
      auVar61 = vminss_avx(auVar62,auVar54);
      auVar51 = vmaxss_avx(auVar54,auVar62);
      auVar62 = vminss_avx(auVar55,auVar56);
      auVar60 = vmaxss_avx(auVar56,auVar55);
      auVar61 = vminss_avx(auVar61,auVar62);
      auVar51 = vmaxss_avx(auVar60,auVar51);
      fVar202 = auVar52._0_4_;
      fVar189 = auVar51._0_4_;
      fVar102 = auVar53._0_4_;
      if ((0.0001 <= fVar202) || (fVar189 <= -0.0001)) {
        uVar15 = vcmpps_avx512vl(auVar61,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar16 = vcmpps_avx512vl(auVar52,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar102 & ((byte)uVar16 | (byte)uVar15)) != 0) goto LAB_01d2c978;
        uVar15 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar51,5);
        uVar16 = vcmpps_avx512vl(auVar61,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar16 | (ushort)uVar15) & 1) == 0) goto LAB_01d2c978;
LAB_01d2d3a7:
        bVar13 = true;
        auVar241 = ZEXT1664(auVar239);
      }
      else {
LAB_01d2c978:
        auVar54 = auVar250._0_16_;
        uVar15 = vcmpss_avx512f(auVar52,auVar54,1);
        bVar13 = (bool)((byte)uVar15 & 1);
        iVar101 = auVar246._0_4_;
        fVar203 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar101);
        uVar15 = vcmpss_avx512f(auVar53,auVar54,1);
        bVar13 = (bool)((byte)uVar15 & 1);
        fVar210 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar101);
        bVar13 = fVar203 != fVar210;
        iVar249 = auVar250._0_4_;
        auVar83._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar90._4_28_ = auVar83._4_28_;
        auVar90._0_4_ = (uint)bVar13 * iVar249 + (uint)!bVar13 * 0x7f800000;
        auVar62 = auVar90._0_16_;
        auVar92._16_16_ = auVar83._16_16_;
        auVar92._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (uint)bVar13 * iVar249 + (uint)!bVar13 * -0x800000;
        auVar60 = auVar91._0_16_;
        uVar15 = vcmpss_avx512f(auVar61,auVar54,1);
        bVar13 = (bool)((byte)uVar15 & 1);
        fVar218 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar101);
        if ((fVar203 != fVar218) || (NAN(fVar203) || NAN(fVar218))) {
          fVar203 = auVar61._0_4_;
          bVar13 = fVar203 == fVar202;
          if ((!bVar13) || (NAN(fVar203) || NAN(fVar202))) {
            auVar52 = vxorps_avx512vl(auVar52,auVar244._0_16_);
            auVar234._0_4_ = auVar52._0_4_ / (fVar203 - fVar202);
            auVar234._4_12_ = auVar52._4_12_;
            auVar52 = vsubss_avx512f(auVar118,auVar234);
            auVar61 = vfmadd213ss_avx512f(auVar52,auVar54,auVar234);
            auVar52 = auVar61;
          }
          else {
            vucomiss_avx512f(auVar54);
            auVar94._16_16_ = auVar83._16_16_;
            auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar13 * iVar249 + (uint)!bVar13 * 0x7f800000;
            auVar61 = auVar93._0_16_;
            auVar52 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar62 = vminss_avx(auVar62,auVar61);
          auVar60 = vmaxss_avx(auVar52,auVar60);
        }
        uVar15 = vcmpss_avx512f(auVar51,auVar54,1);
        bVar13 = (bool)((byte)uVar15 & 1);
        fVar202 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar101);
        if ((fVar210 != fVar202) || (NAN(fVar210) || NAN(fVar202))) {
          bVar13 = fVar189 == fVar102;
          if ((!bVar13) || (NAN(fVar189) || NAN(fVar102))) {
            auVar53 = vxorps_avx512vl(auVar53,auVar244._0_16_);
            auVar193._0_4_ = auVar53._0_4_ / (fVar189 - fVar102);
            auVar193._4_12_ = auVar53._4_12_;
            auVar53 = vsubss_avx512f(auVar118,auVar193);
            auVar51 = vfmadd213ss_avx512f(auVar53,auVar54,auVar193);
            auVar53 = auVar51;
          }
          else {
            vucomiss_avx512f(auVar54);
            auVar96._16_16_ = auVar83._16_16_;
            auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar95._4_28_ = auVar96._4_28_;
            auVar95._0_4_ = (uint)bVar13 * iVar249 + (uint)!bVar13 * 0x7f800000;
            auVar51 = auVar95._0_16_;
            auVar53 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar62 = vminss_avx(auVar62,auVar51);
          auVar60 = vmaxss_avx(auVar53,auVar60);
        }
        bVar13 = fVar218 != fVar202;
        auVar53 = vminss_avx512f(auVar62,auVar118);
        auVar98._16_16_ = auVar83._16_16_;
        auVar98._0_16_ = auVar62;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar13 * auVar53._0_4_ + (uint)!bVar13 * auVar62._0_4_;
        auVar53 = vmaxss_avx512f(auVar118,auVar60);
        auVar100._16_16_ = auVar83._16_16_;
        auVar100._0_16_ = auVar60;
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar13 * auVar53._0_4_ + (uint)!bVar13 * auVar60._0_4_;
        auVar53 = vmaxss_avx512f(auVar54,auVar97._0_16_);
        auVar51 = vminss_avx512f(auVar99._0_16_,auVar118);
        bVar13 = true;
        if (auVar51._0_4_ < auVar53._0_4_) goto LAB_01d2d3a7;
        auVar54 = vmaxss_avx512f(auVar54,ZEXT416((uint)(auVar53._0_4_ + -0.1)));
        auVar55 = vminss_avx512f(ZEXT416((uint)(auVar51._0_4_ + 0.1)),auVar118);
        auVar111._0_8_ = auVar58._0_8_;
        auVar111._8_8_ = auVar111._0_8_;
        auVar184._8_8_ = auVar148._0_8_;
        auVar184._0_8_ = auVar148._0_8_;
        auVar194._8_8_ = auVar152._0_8_;
        auVar194._0_8_ = auVar152._0_8_;
        auVar53 = vshufpd_avx(auVar148,auVar148,3);
        auVar51 = vshufpd_avx(auVar152,auVar152,3);
        auVar60 = vshufps_avx(auVar54,auVar55,0);
        auVar56 = vsubps_avx512vl(auVar49,auVar60);
        fVar102 = auVar60._0_4_;
        auVar224._0_4_ = fVar102 * auVar63._0_4_;
        fVar189 = auVar60._4_4_;
        auVar224._4_4_ = fVar189 * auVar63._4_4_;
        fVar202 = auVar60._8_4_;
        auVar224._8_4_ = fVar202 * auVar63._8_4_;
        fVar203 = auVar60._12_4_;
        auVar224._12_4_ = fVar203 * auVar63._12_4_;
        auVar149._0_4_ = fVar102 * auVar53._0_4_;
        auVar149._4_4_ = fVar189 * auVar53._4_4_;
        auVar149._8_4_ = fVar202 * auVar53._8_4_;
        auVar149._12_4_ = fVar203 * auVar53._12_4_;
        auVar154._0_4_ = fVar102 * auVar51._0_4_;
        auVar154._4_4_ = fVar189 * auVar51._4_4_;
        auVar154._8_4_ = fVar202 * auVar51._8_4_;
        auVar154._12_4_ = fVar203 * auVar51._12_4_;
        auVar130._0_4_ = fVar102 * auVar59._0_4_;
        auVar130._4_4_ = fVar189 * auVar59._4_4_;
        auVar130._8_4_ = fVar202 * auVar59._8_4_;
        auVar130._12_4_ = fVar203 * auVar59._12_4_;
        auVar52 = vfmadd231ps_fma(auVar224,auVar56,auVar111);
        auVar61 = vfmadd231ps_fma(auVar149,auVar56,auVar184);
        auVar62 = vfmadd231ps_fma(auVar154,auVar56,auVar194);
        auVar63 = vfmadd231ps_fma(auVar130,auVar56,ZEXT816(0));
        auVar53 = vsubss_avx512f(auVar118,auVar54);
        auVar51 = vmovshdup_avx512vl(auVar239);
        auVar57 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar51._0_4_ * auVar54._0_4_)),auVar239,
                                      auVar53);
        auVar53 = vsubss_avx512f(auVar118,auVar55);
        auVar58 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar51._0_4_)),auVar239,
                                      auVar53);
        auVar59 = vdivss_avx512f(auVar118,auVar50);
        auVar50 = vsubps_avx(auVar61,auVar52);
        auVar159 = auVar242._0_16_;
        auVar51 = vmulps_avx512vl(auVar50,auVar159);
        auVar50 = vsubps_avx(auVar62,auVar61);
        auVar60 = vmulps_avx512vl(auVar50,auVar159);
        auVar50 = vsubps_avx(auVar63,auVar62);
        auVar50 = vmulps_avx512vl(auVar50,auVar159);
        auVar53 = vminps_avx(auVar60,auVar50);
        auVar50 = vmaxps_avx(auVar60,auVar50);
        auVar53 = vminps_avx(auVar51,auVar53);
        auVar50 = vmaxps_avx(auVar51,auVar50);
        auVar51 = vshufpd_avx(auVar53,auVar53,3);
        auVar60 = vshufpd_avx(auVar50,auVar50,3);
        auVar53 = vminps_avx(auVar53,auVar51);
        auVar50 = vmaxps_avx(auVar50,auVar60);
        fVar102 = auVar59._0_4_;
        auVar176._0_4_ = fVar102 * auVar53._0_4_;
        auVar176._4_4_ = fVar102 * auVar53._4_4_;
        auVar176._8_4_ = fVar102 * auVar53._8_4_;
        auVar176._12_4_ = fVar102 * auVar53._12_4_;
        auVar163._0_4_ = fVar102 * auVar50._0_4_;
        auVar163._4_4_ = fVar102 * auVar50._4_4_;
        auVar163._8_4_ = fVar102 * auVar50._8_4_;
        auVar163._12_4_ = fVar102 * auVar50._12_4_;
        auVar59 = vdivss_avx512f(auVar118,ZEXT416((uint)(auVar58._0_4_ - auVar57._0_4_)));
        auVar50 = vshufpd_avx(auVar52,auVar52,3);
        auVar53 = vshufpd_avx(auVar61,auVar61,3);
        auVar51 = vshufpd_avx(auVar62,auVar62,3);
        auVar60 = vshufpd_avx(auVar63,auVar63,3);
        auVar50 = vsubps_avx(auVar50,auVar52);
        auVar52 = vsubps_avx(auVar53,auVar61);
        auVar61 = vsubps_avx(auVar51,auVar62);
        auVar60 = vsubps_avx(auVar60,auVar63);
        auVar53 = vminps_avx(auVar50,auVar52);
        auVar50 = vmaxps_avx(auVar50,auVar52);
        auVar51 = vminps_avx(auVar61,auVar60);
        auVar51 = vminps_avx(auVar53,auVar51);
        auVar53 = vmaxps_avx(auVar61,auVar60);
        auVar50 = vmaxps_avx(auVar50,auVar53);
        fVar102 = auVar59._0_4_;
        auVar195._0_4_ = fVar102 * auVar51._0_4_;
        auVar195._4_4_ = fVar102 * auVar51._4_4_;
        auVar195._8_4_ = fVar102 * auVar51._8_4_;
        auVar195._12_4_ = fVar102 * auVar51._12_4_;
        auVar205._0_4_ = fVar102 * auVar50._0_4_;
        auVar205._4_4_ = fVar102 * auVar50._4_4_;
        auVar205._8_4_ = fVar102 * auVar50._8_4_;
        auVar205._12_4_ = fVar102 * auVar50._12_4_;
        auVar152 = vinsertps_avx512f(auVar40,auVar57,0x10);
        auVar52 = vinsertps_avx(auVar43,auVar58,0x10);
        auVar103._0_4_ = auVar152._0_4_ + auVar52._0_4_;
        auVar103._4_4_ = auVar152._4_4_ + auVar52._4_4_;
        auVar103._8_4_ = auVar152._8_4_ + auVar52._8_4_;
        auVar103._12_4_ = auVar152._12_4_ + auVar52._12_4_;
        auVar17._8_4_ = 0x3f000000;
        auVar17._0_8_ = 0x3f0000003f000000;
        auVar17._12_4_ = 0x3f000000;
        auVar55 = vmulps_avx512vl(auVar103,auVar17);
        auVar51 = vshufps_avx(auVar55,auVar55,0x54);
        uVar107 = auVar55._0_4_;
        auVar120._4_4_ = uVar107;
        auVar120._0_4_ = uVar107;
        auVar120._8_4_ = uVar107;
        auVar120._12_4_ = uVar107;
        auVar53 = vfmadd213ps_fma(auVar39,auVar120,auVar48);
        auVar61 = vfmadd213ps_avx512vl(auVar46,auVar120,auVar47);
        auVar60 = vfmadd213ps_fma(local_178,auVar120,auVar45);
        auVar50 = vsubps_avx(auVar61,auVar53);
        auVar53 = vfmadd213ps_fma(auVar50,auVar120,auVar53);
        auVar50 = vsubps_avx(auVar60,auVar61);
        auVar50 = vfmadd213ps_fma(auVar50,auVar120,auVar61);
        auVar50 = vsubps_avx(auVar50,auVar53);
        auVar53 = vfmadd231ps_fma(auVar53,auVar50,auVar120);
        auVar62 = vmulps_avx512vl(auVar50,auVar159);
        auVar213._8_8_ = auVar53._0_8_;
        auVar213._0_8_ = auVar53._0_8_;
        auVar50 = vshufpd_avx(auVar53,auVar53,3);
        auVar53 = vshufps_avx(auVar55,auVar55,0x55);
        auVar60 = vsubps_avx(auVar50,auVar213);
        auVar61 = vfmadd231ps_fma(auVar213,auVar53,auVar60);
        auVar235._8_8_ = auVar62._0_8_;
        auVar235._0_8_ = auVar62._0_8_;
        auVar50 = vshufpd_avx(auVar62,auVar62,3);
        auVar50 = vsubps_avx(auVar50,auVar235);
        auVar53 = vfmadd213ps_fma(auVar50,auVar53,auVar235);
        auVar121._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
        auVar121._8_4_ = auVar60._8_4_ ^ 0x80000000;
        auVar121._12_4_ = auVar60._12_4_ ^ 0x80000000;
        auVar50 = vmovshdup_avx(auVar53);
        auVar236._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
        auVar236._8_4_ = auVar50._8_4_ ^ 0x80000000;
        auVar236._12_4_ = auVar50._12_4_ ^ 0x80000000;
        auVar62 = vmovshdup_avx512vl(auVar60);
        auVar63 = vpermt2ps_avx512vl(auVar236,ZEXT416(5),auVar60);
        auVar50 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar50._0_4_ * auVar60._0_4_)),auVar53,auVar62
                                     );
        auVar53 = vpermt2ps_avx512vl(auVar53,SUB6416(ZEXT464(4),0),auVar121);
        auVar131._0_4_ = auVar50._0_4_;
        auVar131._4_4_ = auVar131._0_4_;
        auVar131._8_4_ = auVar131._0_4_;
        auVar131._12_4_ = auVar131._0_4_;
        auVar50 = vdivps_avx(auVar63,auVar131);
        auVar53 = vdivps_avx(auVar53,auVar131);
        fVar189 = auVar61._0_4_;
        auVar60 = vshufps_avx(auVar61,auVar61,0x55);
        fVar102 = auVar53._0_4_;
        auVar214._0_4_ = fVar189 * auVar50._0_4_ + auVar60._0_4_ * fVar102;
        auVar214._4_4_ = fVar189 * auVar50._4_4_ + auVar60._4_4_ * auVar53._4_4_;
        auVar214._8_4_ = fVar189 * auVar50._8_4_ + auVar60._8_4_ * auVar53._8_4_;
        auVar214._12_4_ = fVar189 * auVar50._12_4_ + auVar60._12_4_ * auVar53._12_4_;
        auVar56 = vsubps_avx(auVar51,auVar214);
        auVar61 = vmovshdup_avx(auVar50);
        auVar51 = vinsertps_avx(auVar176,auVar195,0x1c);
        auVar237._0_4_ = auVar61._0_4_ * auVar51._0_4_;
        auVar237._4_4_ = auVar61._4_4_ * auVar51._4_4_;
        auVar237._8_4_ = auVar61._8_4_ * auVar51._8_4_;
        auVar237._12_4_ = auVar61._12_4_ * auVar51._12_4_;
        auVar60 = vinsertps_avx(auVar163,auVar205,0x1c);
        auVar215._0_4_ = auVar61._0_4_ * auVar60._0_4_;
        auVar215._4_4_ = auVar61._4_4_ * auVar60._4_4_;
        auVar215._8_4_ = auVar61._8_4_ * auVar60._8_4_;
        auVar215._12_4_ = auVar61._12_4_ * auVar60._12_4_;
        auVar54 = vminps_avx512vl(auVar237,auVar215);
        auVar63 = vmaxps_avx(auVar215,auVar237);
        auVar59 = vmovshdup_avx(auVar53);
        auVar61 = vinsertps_avx(auVar195,auVar176,0x4c);
        auVar196._0_4_ = auVar59._0_4_ * auVar61._0_4_;
        auVar196._4_4_ = auVar59._4_4_ * auVar61._4_4_;
        auVar196._8_4_ = auVar59._8_4_ * auVar61._8_4_;
        auVar196._12_4_ = auVar59._12_4_ * auVar61._12_4_;
        auVar62 = vinsertps_avx(auVar205,auVar163,0x4c);
        auVar206._0_4_ = auVar59._0_4_ * auVar62._0_4_;
        auVar206._4_4_ = auVar59._4_4_ * auVar62._4_4_;
        auVar206._8_4_ = auVar59._8_4_ * auVar62._8_4_;
        auVar206._12_4_ = auVar59._12_4_ * auVar62._12_4_;
        auVar59 = vminps_avx(auVar196,auVar206);
        auVar54 = vaddps_avx512vl(auVar54,auVar59);
        auVar59 = vmaxps_avx(auVar206,auVar196);
        auVar197._0_4_ = auVar63._0_4_ + auVar59._0_4_;
        auVar197._4_4_ = auVar63._4_4_ + auVar59._4_4_;
        auVar197._8_4_ = auVar63._8_4_ + auVar59._8_4_;
        auVar197._12_4_ = auVar63._12_4_ + auVar59._12_4_;
        auVar207._8_8_ = 0x3f80000000000000;
        auVar207._0_8_ = 0x3f80000000000000;
        auVar63 = vsubps_avx(auVar207,auVar197);
        auVar59 = vsubps_avx(auVar207,auVar54);
        auVar54 = vsubps_avx(auVar152,auVar55);
        auVar55 = vsubps_avx(auVar52,auVar55);
        fVar218 = auVar54._0_4_;
        auVar238._0_4_ = fVar218 * auVar63._0_4_;
        fVar219 = auVar54._4_4_;
        auVar238._4_4_ = fVar219 * auVar63._4_4_;
        fVar220 = auVar54._8_4_;
        auVar238._8_4_ = fVar220 * auVar63._8_4_;
        fVar221 = auVar54._12_4_;
        auVar238._12_4_ = fVar221 * auVar63._12_4_;
        auVar64 = vbroadcastss_avx512vl(auVar50);
        auVar51 = vmulps_avx512vl(auVar64,auVar51);
        auVar60 = vmulps_avx512vl(auVar64,auVar60);
        auVar64 = vminps_avx512vl(auVar51,auVar60);
        auVar51 = vmaxps_avx(auVar60,auVar51);
        auVar177._0_4_ = fVar102 * auVar61._0_4_;
        auVar177._4_4_ = fVar102 * auVar61._4_4_;
        auVar177._8_4_ = fVar102 * auVar61._8_4_;
        auVar177._12_4_ = fVar102 * auVar61._12_4_;
        auVar164._0_4_ = fVar102 * auVar62._0_4_;
        auVar164._4_4_ = fVar102 * auVar62._4_4_;
        auVar164._8_4_ = fVar102 * auVar62._8_4_;
        auVar164._12_4_ = fVar102 * auVar62._12_4_;
        auVar60 = vminps_avx(auVar177,auVar164);
        auVar61 = vaddps_avx512vl(auVar64,auVar60);
        auVar62 = vmulps_avx512vl(auVar54,auVar59);
        fVar189 = auVar55._0_4_;
        auVar198._0_4_ = fVar189 * auVar63._0_4_;
        fVar202 = auVar55._4_4_;
        auVar198._4_4_ = fVar202 * auVar63._4_4_;
        fVar203 = auVar55._8_4_;
        auVar198._8_4_ = fVar203 * auVar63._8_4_;
        fVar210 = auVar55._12_4_;
        auVar198._12_4_ = fVar210 * auVar63._12_4_;
        auVar208._0_4_ = fVar189 * auVar59._0_4_;
        auVar208._4_4_ = fVar202 * auVar59._4_4_;
        auVar208._8_4_ = fVar203 * auVar59._8_4_;
        auVar208._12_4_ = fVar210 * auVar59._12_4_;
        auVar60 = vmaxps_avx(auVar164,auVar177);
        auVar165._0_4_ = auVar51._0_4_ + auVar60._0_4_;
        auVar165._4_4_ = auVar51._4_4_ + auVar60._4_4_;
        auVar165._8_4_ = auVar51._8_4_ + auVar60._8_4_;
        auVar165._12_4_ = auVar51._12_4_ + auVar60._12_4_;
        auVar178._8_8_ = 0x3f800000;
        auVar178._0_8_ = 0x3f800000;
        auVar51 = vsubps_avx(auVar178,auVar165);
        auVar60 = vsubps_avx(auVar178,auVar61);
        auVar225._0_4_ = fVar218 * auVar51._0_4_;
        auVar225._4_4_ = fVar219 * auVar51._4_4_;
        auVar225._8_4_ = fVar220 * auVar51._8_4_;
        auVar225._12_4_ = fVar221 * auVar51._12_4_;
        auVar216._0_4_ = fVar218 * auVar60._0_4_;
        auVar216._4_4_ = fVar219 * auVar60._4_4_;
        auVar216._8_4_ = fVar220 * auVar60._8_4_;
        auVar216._12_4_ = fVar221 * auVar60._12_4_;
        auVar166._0_4_ = fVar189 * auVar51._0_4_;
        auVar166._4_4_ = fVar202 * auVar51._4_4_;
        auVar166._8_4_ = fVar203 * auVar51._8_4_;
        auVar166._12_4_ = fVar210 * auVar51._12_4_;
        auVar179._0_4_ = fVar189 * auVar60._0_4_;
        auVar179._4_4_ = fVar202 * auVar60._4_4_;
        auVar179._8_4_ = fVar203 * auVar60._8_4_;
        auVar179._12_4_ = fVar210 * auVar60._12_4_;
        auVar51 = vminps_avx(auVar225,auVar216);
        auVar60 = vminps_avx(auVar166,auVar179);
        auVar61 = vminps_avx(auVar51,auVar60);
        auVar51 = vmaxps_avx(auVar216,auVar225);
        auVar60 = vmaxps_avx(auVar179,auVar166);
        auVar60 = vmaxps_avx(auVar60,auVar51);
        auVar63 = vminps_avx512vl(auVar238,auVar62);
        auVar51 = vminps_avx(auVar198,auVar208);
        auVar51 = vminps_avx(auVar63,auVar51);
        auVar51 = vhaddps_avx(auVar61,auVar51);
        auVar62 = vmaxps_avx512vl(auVar62,auVar238);
        auVar61 = vmaxps_avx(auVar208,auVar198);
        auVar61 = vmaxps_avx(auVar61,auVar62);
        auVar60 = vhaddps_avx(auVar60,auVar61);
        auVar51 = vshufps_avx(auVar51,auVar51,0xe8);
        auVar60 = vshufps_avx(auVar60,auVar60,0xe8);
        auVar167._0_4_ = auVar51._0_4_ + auVar56._0_4_;
        auVar167._4_4_ = auVar51._4_4_ + auVar56._4_4_;
        auVar167._8_4_ = auVar51._8_4_ + auVar56._8_4_;
        auVar167._12_4_ = auVar51._12_4_ + auVar56._12_4_;
        auVar180._0_4_ = auVar60._0_4_ + auVar56._0_4_;
        auVar180._4_4_ = auVar60._4_4_ + auVar56._4_4_;
        auVar180._8_4_ = auVar60._8_4_ + auVar56._8_4_;
        auVar180._12_4_ = auVar60._12_4_ + auVar56._12_4_;
        auVar51 = vmaxps_avx(auVar152,auVar167);
        auVar60 = vminps_avx(auVar180,auVar52);
        uVar36 = vcmpps_avx512vl(auVar60,auVar51,1);
        local_348 = vinsertps_avx(auVar57,auVar58,0x10);
        auVar241 = ZEXT1664(local_348);
        auVar51 = ZEXT416(5);
        if ((uVar36 & 3) == 0) {
          vucomiss_avx512f(auVar40);
          auVar51 = vxorps_avx512vl(auVar51,auVar51);
          auVar250 = ZEXT1664(auVar51);
          if ((uint)uVar31 < 4 && (uVar6 == 0 || lVar35 == 0)) {
            bVar13 = false;
          }
          else {
            lVar35 = 200;
            do {
              auVar60 = vsubss_avx512f(auVar118,auVar56);
              fVar203 = auVar60._0_4_;
              fVar189 = fVar203 * fVar203 * fVar203;
              fVar210 = auVar56._0_4_;
              fVar202 = fVar210 * 3.0 * fVar203 * fVar203;
              fVar203 = fVar203 * fVar210 * fVar210 * 3.0;
              auVar150._4_4_ = fVar189;
              auVar150._0_4_ = fVar189;
              auVar150._8_4_ = fVar189;
              auVar150._12_4_ = fVar189;
              auVar138._4_4_ = fVar202;
              auVar138._0_4_ = fVar202;
              auVar138._8_4_ = fVar202;
              auVar138._12_4_ = fVar202;
              auVar112._4_4_ = fVar203;
              auVar112._0_4_ = fVar203;
              auVar112._8_4_ = fVar203;
              auVar112._12_4_ = fVar203;
              fVar210 = fVar210 * fVar210 * fVar210;
              auVar155._0_4_ = (float)local_328._0_4_ * fVar210;
              auVar155._4_4_ = (float)local_328._4_4_ * fVar210;
              auVar155._8_4_ = fStack_320 * fVar210;
              auVar155._12_4_ = fStack_31c * fVar210;
              auVar60 = vfmadd231ps_fma(auVar155,auVar45,auVar112);
              auVar60 = vfmadd231ps_fma(auVar60,auVar47,auVar138);
              auVar60 = vfmadd231ps_fma(auVar60,auVar48,auVar150);
              auVar113._8_8_ = auVar60._0_8_;
              auVar113._0_8_ = auVar60._0_8_;
              auVar60 = vshufpd_avx(auVar60,auVar60,3);
              auVar52 = vshufps_avx(auVar56,auVar56,0x55);
              auVar60 = vsubps_avx(auVar60,auVar113);
              auVar52 = vfmadd213ps_fma(auVar60,auVar52,auVar113);
              fVar189 = auVar52._0_4_;
              auVar60 = vshufps_avx(auVar52,auVar52,0x55);
              auVar114._0_4_ = auVar50._0_4_ * fVar189 + fVar102 * auVar60._0_4_;
              auVar114._4_4_ = auVar50._4_4_ * fVar189 + auVar53._4_4_ * auVar60._4_4_;
              auVar114._8_4_ = auVar50._8_4_ * fVar189 + auVar53._8_4_ * auVar60._8_4_;
              auVar114._12_4_ = auVar50._12_4_ * fVar189 + auVar53._12_4_ * auVar60._12_4_;
              auVar56 = vsubps_avx(auVar56,auVar114);
              auVar60 = vandps_avx512vl(auVar52,auVar243._0_16_);
              auVar52 = vprolq_avx512vl(auVar60,0x20);
              auVar60 = vmaxss_avx(auVar52,auVar60);
              bVar14 = auVar60._0_4_ <= (float)local_338._0_4_;
              if (auVar60._0_4_ < (float)local_338._0_4_) {
                auVar50 = vucomiss_avx512f(auVar51);
                if (bVar14) {
                  auVar118 = vucomiss_avx512f(auVar50);
                  auVar246 = ZEXT1664(auVar118);
                  if (bVar14) {
                    vmovshdup_avx(auVar50);
                    auVar118 = vucomiss_avx512f(auVar51);
                    if (bVar14) {
                      auVar53 = vucomiss_avx512f(auVar118);
                      auVar246 = ZEXT1664(auVar53);
                      if (bVar14) {
                        auVar60 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar55 = vinsertps_avx(auVar60,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar60 = vdpps_avx(auVar55,local_188,0x7f);
                        auVar52 = vdpps_avx(auVar55,local_198,0x7f);
                        auVar61 = vdpps_avx(auVar55,local_1a8,0x7f);
                        auVar62 = vdpps_avx(auVar55,local_1b8,0x7f);
                        auVar63 = vdpps_avx(auVar55,local_1c8,0x7f);
                        auVar59 = vdpps_avx(auVar55,local_1d8,0x7f);
                        auVar54 = vdpps_avx(auVar55,local_1e8,0x7f);
                        auVar55 = vdpps_avx(auVar55,local_1f8,0x7f);
                        auVar56 = vsubss_avx512f(auVar53,auVar118);
                        fVar203 = auVar118._0_4_;
                        auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar63._0_4_)),auVar56,
                                                   auVar60);
                        auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar203)),auVar56,
                                                  auVar52);
                        auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar203)),auVar56,
                                                  auVar61);
                        auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar55._0_4_)),auVar56,
                                                  auVar62);
                        auVar53 = vsubss_avx512f(auVar53,auVar50);
                        auVar185._0_4_ = auVar53._0_4_;
                        fVar102 = auVar185._0_4_ * auVar185._0_4_ * auVar185._0_4_;
                        local_118 = auVar50._0_4_;
                        fVar189 = local_118 * 3.0 * auVar185._0_4_ * auVar185._0_4_;
                        fVar202 = auVar185._0_4_ * local_118 * local_118 * 3.0;
                        fVar218 = local_118 * local_118 * local_118;
                        auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * auVar61._0_4_)),
                                                  ZEXT416((uint)fVar202),auVar52);
                        auVar53 = vfmadd231ss_fma(auVar53,ZEXT416((uint)fVar189),auVar60);
                        auVar118 = vfmadd231ss_fma(auVar53,ZEXT416((uint)fVar102),auVar118);
                        fVar210 = auVar118._0_4_;
                        if ((fVar126 <= fVar210) &&
                           (fVar219 = *(float *)(ray + k * 4 + 0x80), fVar210 <= fVar219)) {
                          local_108 = vshufps_avx(auVar50,auVar50,0x55);
                          auVar53 = vsubps_avx512vl(auVar49,local_108);
                          fVar220 = local_108._0_4_;
                          auVar199._0_4_ = fVar220 * (float)local_218._0_4_;
                          fVar221 = local_108._4_4_;
                          auVar199._4_4_ = fVar221 * (float)local_218._4_4_;
                          fVar231 = local_108._8_4_;
                          auVar199._8_4_ = fVar231 * fStack_210;
                          fVar232 = local_108._12_4_;
                          auVar199._12_4_ = fVar232 * fStack_20c;
                          auVar209._0_4_ = fVar220 * (float)local_268._0_4_;
                          auVar209._4_4_ = fVar221 * (float)local_268._4_4_;
                          auVar209._8_4_ = fVar231 * fStack_260;
                          auVar209._12_4_ = fVar232 * fStack_25c;
                          auVar217._0_4_ = fVar220 * (float)local_278._0_4_;
                          auVar217._4_4_ = fVar221 * (float)local_278._4_4_;
                          auVar217._8_4_ = fVar231 * fStack_270;
                          auVar217._12_4_ = fVar232 * fStack_26c;
                          auVar226._0_4_ = fVar220 * (float)local_238._0_4_;
                          auVar226._4_4_ = fVar221 * (float)local_238._4_4_;
                          auVar226._8_4_ = fVar231 * fStack_230;
                          auVar226._12_4_ = fVar232 * fStack_22c;
                          auVar49 = vfmadd231ps_fma(auVar199,auVar53,local_208);
                          auVar50 = vfmadd231ps_fma(auVar209,auVar53,local_248);
                          auVar118 = vfmadd231ps_fma(auVar217,auVar53,local_258);
                          auVar53 = vfmadd231ps_fma(auVar226,auVar53,local_228);
                          auVar49 = vsubps_avx(auVar50,auVar49);
                          auVar50 = vsubps_avx(auVar118,auVar50);
                          auVar118 = vsubps_avx(auVar53,auVar118);
                          auVar227._0_4_ = local_118 * auVar50._0_4_;
                          auVar227._4_4_ = local_118 * auVar50._4_4_;
                          auVar227._8_4_ = local_118 * auVar50._8_4_;
                          auVar227._12_4_ = local_118 * auVar50._12_4_;
                          auVar185._4_4_ = auVar185._0_4_;
                          auVar185._8_4_ = auVar185._0_4_;
                          auVar185._12_4_ = auVar185._0_4_;
                          auVar49 = vfmadd231ps_fma(auVar227,auVar185,auVar49);
                          auVar200._0_4_ = local_118 * auVar118._0_4_;
                          auVar200._4_4_ = local_118 * auVar118._4_4_;
                          auVar200._8_4_ = local_118 * auVar118._8_4_;
                          auVar200._12_4_ = local_118 * auVar118._12_4_;
                          auVar50 = vfmadd231ps_fma(auVar200,auVar185,auVar50);
                          auVar201._0_4_ = local_118 * auVar50._0_4_;
                          auVar201._4_4_ = local_118 * auVar50._4_4_;
                          auVar201._8_4_ = local_118 * auVar50._8_4_;
                          auVar201._12_4_ = local_118 * auVar50._12_4_;
                          auVar49 = vfmadd231ps_fma(auVar201,auVar185,auVar49);
                          auVar49 = vmulps_avx512vl(auVar49,auVar159);
                          pGVar7 = (context->scene->geometries).items[uVar37].ptr;
                          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                            auVar168._0_4_ = fVar218 * (float)local_2b8._0_4_;
                            auVar168._4_4_ = fVar218 * (float)local_2b8._4_4_;
                            auVar168._8_4_ = fVar218 * fStack_2b0;
                            auVar168._12_4_ = fVar218 * fStack_2ac;
                            auVar156._4_4_ = fVar202;
                            auVar156._0_4_ = fVar202;
                            auVar156._8_4_ = fVar202;
                            auVar156._12_4_ = fVar202;
                            auVar50 = vfmadd132ps_fma(auVar156,auVar168,local_2a8);
                            auVar151._4_4_ = fVar189;
                            auVar151._0_4_ = fVar189;
                            auVar151._8_4_ = fVar189;
                            auVar151._12_4_ = fVar189;
                            auVar50 = vfmadd132ps_fma(auVar151,auVar50,local_298);
                            auVar139._4_4_ = fVar102;
                            auVar139._0_4_ = fVar102;
                            auVar139._8_4_ = fVar102;
                            auVar139._12_4_ = fVar102;
                            auVar53 = vfmadd132ps_fma(auVar139,auVar50,local_288);
                            auVar50 = vshufps_avx(auVar53,auVar53,0xc9);
                            auVar118 = vshufps_avx(auVar49,auVar49,0xc9);
                            auVar140._0_4_ = auVar53._0_4_ * auVar118._0_4_;
                            auVar140._4_4_ = auVar53._4_4_ * auVar118._4_4_;
                            auVar140._8_4_ = auVar53._8_4_ * auVar118._8_4_;
                            auVar140._12_4_ = auVar53._12_4_ * auVar118._12_4_;
                            auVar49 = vfmsub231ps_fma(auVar140,auVar49,auVar50);
                            local_128 = auVar49._0_4_;
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              *(float *)(ray + k * 4 + 0x80) = fVar210;
                              uVar107 = vextractps_avx(auVar49,1);
                              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar107;
                              uVar107 = vextractps_avx(auVar49,2);
                              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar107;
                              *(undefined4 *)(ray + k * 4 + 0xe0) = local_128;
                              *(float *)(ray + k * 4 + 0xf0) = local_118;
                              *(float *)(ray + k * 4 + 0x100) = fVar203;
                              *(uint *)(ray + k * 4 + 0x110) = uVar5;
                              *(uint *)(ray + k * 4 + 0x120) = uVar37;
                              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                            }
                            else {
                              auVar50 = vshufps_avx(auVar49,auVar49,0x55);
                              local_138 = vshufps_avx(auVar49,auVar49,0xaa);
                              local_148[0] = (RTCHitN)auVar50[0];
                              local_148[1] = (RTCHitN)auVar50[1];
                              local_148[2] = (RTCHitN)auVar50[2];
                              local_148[3] = (RTCHitN)auVar50[3];
                              local_148[4] = (RTCHitN)auVar50[4];
                              local_148[5] = (RTCHitN)auVar50[5];
                              local_148[6] = (RTCHitN)auVar50[6];
                              local_148[7] = (RTCHitN)auVar50[7];
                              local_148[8] = (RTCHitN)auVar50[8];
                              local_148[9] = (RTCHitN)auVar50[9];
                              local_148[10] = (RTCHitN)auVar50[10];
                              local_148[0xb] = (RTCHitN)auVar50[0xb];
                              local_148[0xc] = (RTCHitN)auVar50[0xc];
                              local_148[0xd] = (RTCHitN)auVar50[0xd];
                              local_148[0xe] = (RTCHitN)auVar50[0xe];
                              local_148[0xf] = (RTCHitN)auVar50[0xf];
                              uStack_124 = local_128;
                              uStack_120 = local_128;
                              uStack_11c = local_128;
                              fStack_114 = local_118;
                              fStack_110 = local_118;
                              fStack_10c = local_118;
                              local_f8 = local_2d8._0_8_;
                              uStack_f0 = local_2d8._8_8_;
                              local_e8 = local_2c8;
                              vpcmpeqd_avx2(ZEXT1632(local_2c8),ZEXT1632(local_2c8));
                              uStack_d4 = context->user->instID[0];
                              local_d8 = uStack_d4;
                              uStack_d0 = uStack_d4;
                              uStack_cc = uStack_d4;
                              uStack_c8 = context->user->instPrimID[0];
                              uStack_c4 = uStack_c8;
                              uStack_c0 = uStack_c8;
                              uStack_bc = uStack_c8;
                              *(float *)(ray + k * 4 + 0x80) = fVar210;
                              local_388 = local_2e8._0_8_;
                              uStack_380 = local_2e8._8_8_;
                              local_378.valid = (int *)&local_388;
                              local_378.geometryUserPtr = pGVar7->userPtr;
                              local_378.context = context->user;
                              local_378.hit = local_148;
                              local_378.N = 4;
                              local_378.ray = (RTCRayN *)ray;
                              if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar7->intersectionFilterN)(&local_378);
                                auVar241 = ZEXT1664(local_348);
                                auVar49 = vxorps_avx512vl(auVar51,auVar51);
                                auVar250 = ZEXT1664(auVar49);
                                auVar246 = ZEXT464(0x3f800000);
                                auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar245 = ZEXT3264(auVar70);
                                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar244 = ZEXT1664(auVar49);
                                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar243 = ZEXT1664(auVar49);
                                auVar49 = vxorps_avx512vl(auVar44,auVar44);
                                auVar251 = ZEXT1664(auVar49);
                                auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
                                auVar83._16_16_ = auVar70._16_16_;
                                auVar248 = ZEXT3264(auVar70);
                              }
                              auVar44 = auVar251._0_16_;
                              auVar49 = auVar250._0_16_;
                              auVar27._8_8_ = uStack_380;
                              auVar27._0_8_ = local_388;
                              uVar36 = vptestmd_avx512vl(auVar27,auVar27);
                              if ((uVar36 & 0xf) == 0) {
LAB_01d2d770:
                                *(float *)(ray + k * 4 + 0x80) = fVar219;
                              }
                              else {
                                p_Var8 = context->args->filter;
                                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var8)(&local_378);
                                  auVar241 = ZEXT1664(local_348);
                                  auVar49 = vxorps_avx512vl(auVar49,auVar49);
                                  auVar250 = ZEXT1664(auVar49);
                                  auVar246 = ZEXT464(0x3f800000);
                                  auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar245 = ZEXT3264(auVar70);
                                  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar244 = ZEXT1664(auVar49);
                                  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar243 = ZEXT1664(auVar49);
                                  auVar49 = vxorps_avx512vl(auVar44,auVar44);
                                  auVar251 = ZEXT1664(auVar49);
                                  auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar83._16_16_ = auVar70._16_16_;
                                  auVar248 = ZEXT3264(auVar70);
                                }
                                auVar28._8_8_ = uStack_380;
                                auVar28._0_8_ = local_388;
                                uVar36 = vptestmd_avx512vl(auVar28,auVar28);
                                uVar36 = uVar36 & 0xf;
                                bVar29 = (byte)uVar36;
                                if (bVar29 == 0) goto LAB_01d2d770;
                                iVar101 = *(int *)(local_378.hit + 4);
                                iVar249 = *(int *)(local_378.hit + 8);
                                iVar26 = *(int *)(local_378.hit + 0xc);
                                bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar36 >> 2) & 1);
                                bVar12 = SUB81(uVar36 >> 3,0);
                                *(uint *)(local_378.ray + 0xc0) =
                                     (uint)(bVar29 & 1) * *(int *)local_378.hit |
                                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_378.ray + 0xc0);
                                *(uint *)(local_378.ray + 0xc4) =
                                     (uint)bVar14 * iVar101 |
                                     (uint)!bVar14 * *(int *)(local_378.ray + 0xc4);
                                *(uint *)(local_378.ray + 200) =
                                     (uint)bVar11 * iVar249 |
                                     (uint)!bVar11 * *(int *)(local_378.ray + 200);
                                *(uint *)(local_378.ray + 0xcc) =
                                     (uint)bVar12 * iVar26 |
                                     (uint)!bVar12 * *(int *)(local_378.ray + 0xcc);
                                iVar101 = *(int *)(local_378.hit + 0x14);
                                iVar249 = *(int *)(local_378.hit + 0x18);
                                iVar26 = *(int *)(local_378.hit + 0x1c);
                                bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar36 >> 2) & 1);
                                bVar12 = SUB81(uVar36 >> 3,0);
                                *(uint *)(local_378.ray + 0xd0) =
                                     (uint)(bVar29 & 1) * *(int *)(local_378.hit + 0x10) |
                                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_378.ray + 0xd0);
                                *(uint *)(local_378.ray + 0xd4) =
                                     (uint)bVar14 * iVar101 |
                                     (uint)!bVar14 * *(int *)(local_378.ray + 0xd4);
                                *(uint *)(local_378.ray + 0xd8) =
                                     (uint)bVar11 * iVar249 |
                                     (uint)!bVar11 * *(int *)(local_378.ray + 0xd8);
                                *(uint *)(local_378.ray + 0xdc) =
                                     (uint)bVar12 * iVar26 |
                                     (uint)!bVar12 * *(int *)(local_378.ray + 0xdc);
                                iVar101 = *(int *)(local_378.hit + 0x24);
                                iVar249 = *(int *)(local_378.hit + 0x28);
                                iVar26 = *(int *)(local_378.hit + 0x2c);
                                bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar36 >> 2) & 1);
                                bVar12 = SUB81(uVar36 >> 3,0);
                                *(uint *)(local_378.ray + 0xe0) =
                                     (uint)(bVar29 & 1) * *(int *)(local_378.hit + 0x20) |
                                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_378.ray + 0xe0);
                                *(uint *)(local_378.ray + 0xe4) =
                                     (uint)bVar14 * iVar101 |
                                     (uint)!bVar14 * *(int *)(local_378.ray + 0xe4);
                                *(uint *)(local_378.ray + 0xe8) =
                                     (uint)bVar11 * iVar249 |
                                     (uint)!bVar11 * *(int *)(local_378.ray + 0xe8);
                                *(uint *)(local_378.ray + 0xec) =
                                     (uint)bVar12 * iVar26 |
                                     (uint)!bVar12 * *(int *)(local_378.ray + 0xec);
                                iVar101 = *(int *)(local_378.hit + 0x34);
                                iVar249 = *(int *)(local_378.hit + 0x38);
                                iVar26 = *(int *)(local_378.hit + 0x3c);
                                bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar36 >> 2) & 1);
                                bVar12 = SUB81(uVar36 >> 3,0);
                                *(uint *)(local_378.ray + 0xf0) =
                                     (uint)(bVar29 & 1) * *(int *)(local_378.hit + 0x30) |
                                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_378.ray + 0xf0);
                                *(uint *)(local_378.ray + 0xf4) =
                                     (uint)bVar14 * iVar101 |
                                     (uint)!bVar14 * *(int *)(local_378.ray + 0xf4);
                                *(uint *)(local_378.ray + 0xf8) =
                                     (uint)bVar11 * iVar249 |
                                     (uint)!bVar11 * *(int *)(local_378.ray + 0xf8);
                                *(uint *)(local_378.ray + 0xfc) =
                                     (uint)bVar12 * iVar26 |
                                     (uint)!bVar12 * *(int *)(local_378.ray + 0xfc);
                                iVar101 = *(int *)(local_378.hit + 0x44);
                                iVar249 = *(int *)(local_378.hit + 0x48);
                                iVar26 = *(int *)(local_378.hit + 0x4c);
                                bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar36 >> 2) & 1);
                                bVar12 = SUB81(uVar36 >> 3,0);
                                *(uint *)(local_378.ray + 0x100) =
                                     (uint)(bVar29 & 1) * *(int *)(local_378.hit + 0x40) |
                                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_378.ray + 0x100);
                                *(uint *)(local_378.ray + 0x104) =
                                     (uint)bVar14 * iVar101 |
                                     (uint)!bVar14 * *(int *)(local_378.ray + 0x104);
                                *(uint *)(local_378.ray + 0x108) =
                                     (uint)bVar11 * iVar249 |
                                     (uint)!bVar11 * *(int *)(local_378.ray + 0x108);
                                *(uint *)(local_378.ray + 0x10c) =
                                     (uint)bVar12 * iVar26 |
                                     (uint)!bVar12 * *(int *)(local_378.ray + 0x10c);
                                auVar49 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_378.hit + 0x50));
                                *(undefined1 (*) [16])(local_378.ray + 0x110) = auVar49;
                                auVar49 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_378.hit + 0x60));
                                *(undefined1 (*) [16])(local_378.ray + 0x120) = auVar49;
                                auVar49 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_378.hit + 0x70));
                                *(undefined1 (*) [16])(local_378.ray + 0x130) = auVar49;
                                auVar49 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_378.hit + 0x80));
                                *(undefined1 (*) [16])(local_378.ray + 0x140) = auVar49;
                              }
                              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar242 = ZEXT1664(auVar49);
                              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar247 = ZEXT1664(auVar49);
                            }
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar35 = lVar35 + -1;
            } while (lVar35 != 0);
          }
        }
        else {
          auVar49 = vxorps_avx512vl(ZEXT416(5),auVar51);
          auVar250 = ZEXT1664(auVar49);
        }
      }
    } while (bVar13);
    auVar49 = vinsertps_avx512f(auVar40,auVar43,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }